

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  byte bVar83;
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  ulong uVar90;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar91;
  long lVar92;
  bool bVar93;
  ulong uVar94;
  uint uVar95;
  uint uVar153;
  uint uVar154;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  uint uVar155;
  uint uVar159;
  undefined1 auVar146 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [32];
  float pp;
  float fVar160;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined4 uVar161;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  float fVar213;
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar238 [32];
  float fVar245;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  float t;
  float fVar253;
  float fVar258;
  undefined1 auVar254 [16];
  float fVar256;
  float fVar257;
  undefined1 auVar255 [64];
  float s;
  undefined1 auVar260 [32];
  undefined1 auVar259 [16];
  undefined1 auVar261 [64];
  float s_1;
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_9d0;
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 (*local_908) [32];
  Primitive *local_900;
  ulong local_8f8;
  ulong local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  RTCHitN local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 auVar148 [32];
  undefined1 auVar151 [32];
  
  PVar1 = prim[1];
  uVar90 = (ulong)(byte)PVar1;
  fVar214 = *(float *)(prim + uVar90 * 0x19 + 0x12);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar103 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar237 = vsubps_avx(auVar98,*(undefined1 (*) [16])(prim + uVar90 * 0x19 + 6));
  fVar213 = fVar214 * auVar237._0_4_;
  fVar160 = fVar214 * auVar103._0_4_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar90 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar98);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar90 * 5 + 6);
  auVar111 = vpmovsxbd_avx2(auVar14);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar90 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar96);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar90 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar100);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar120 = vpmovsxbd_avx2(auVar99);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar116 = vcvtdq2ps_avx(auVar120);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar90 + 6);
  auVar112 = vpmovsxbd_avx2(auVar97);
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar94 = (ulong)(uint)((int)(uVar90 * 9) * 2);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar117 = vpmovsxbd_avx2(auVar101);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar94 + uVar90 + 6);
  auVar118 = vpmovsxbd_avx2(auVar102);
  auVar118 = vcvtdq2ps_avx(auVar118);
  uVar86 = (ulong)(uint)((int)(uVar90 * 5) << 2);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar86 + 6);
  auVar110 = vpmovsxbd_avx2(auVar254);
  auVar119 = vcvtdq2ps_avx(auVar110);
  auVar130._4_4_ = fVar160;
  auVar130._0_4_ = fVar160;
  auVar130._8_4_ = fVar160;
  auVar130._12_4_ = fVar160;
  auVar130._16_4_ = fVar160;
  auVar130._20_4_ = fVar160;
  auVar130._24_4_ = fVar160;
  auVar130._28_4_ = fVar160;
  auVar132._8_4_ = 1;
  auVar132._0_8_ = 0x100000001;
  auVar132._12_4_ = 1;
  auVar132._16_4_ = 1;
  auVar132._20_4_ = 1;
  auVar132._24_4_ = 1;
  auVar132._28_4_ = 1;
  auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar122 = ZEXT1632(CONCAT412(fVar214 * auVar103._12_4_,
                                CONCAT48(fVar214 * auVar103._8_4_,
                                         CONCAT44(fVar214 * auVar103._4_4_,fVar160))));
  auVar121 = vpermps_avx2(auVar132,auVar122);
  auVar109 = vpermps_avx512vl(auVar108,auVar122);
  fVar160 = auVar109._0_4_;
  fVar239 = auVar109._4_4_;
  auVar122._4_4_ = fVar239 * auVar114._4_4_;
  auVar122._0_4_ = fVar160 * auVar114._0_4_;
  fVar240 = auVar109._8_4_;
  auVar122._8_4_ = fVar240 * auVar114._8_4_;
  fVar241 = auVar109._12_4_;
  auVar122._12_4_ = fVar241 * auVar114._12_4_;
  fVar244 = auVar109._16_4_;
  auVar122._16_4_ = fVar244 * auVar114._16_4_;
  fVar242 = auVar109._20_4_;
  auVar122._20_4_ = fVar242 * auVar114._20_4_;
  fVar243 = auVar109._24_4_;
  auVar122._24_4_ = fVar243 * auVar114._24_4_;
  auVar122._28_4_ = auVar120._28_4_;
  auVar120._4_4_ = auVar112._4_4_ * fVar239;
  auVar120._0_4_ = auVar112._0_4_ * fVar160;
  auVar120._8_4_ = auVar112._8_4_ * fVar240;
  auVar120._12_4_ = auVar112._12_4_ * fVar241;
  auVar120._16_4_ = auVar112._16_4_ * fVar244;
  auVar120._20_4_ = auVar112._20_4_ * fVar242;
  auVar120._24_4_ = auVar112._24_4_ * fVar243;
  auVar120._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar119._4_4_ * fVar239;
  auVar110._0_4_ = auVar119._0_4_ * fVar160;
  auVar110._8_4_ = auVar119._8_4_ * fVar240;
  auVar110._12_4_ = auVar119._12_4_ * fVar241;
  auVar110._16_4_ = auVar119._16_4_ * fVar244;
  auVar110._20_4_ = auVar119._20_4_ * fVar242;
  auVar110._24_4_ = auVar119._24_4_ * fVar243;
  auVar110._28_4_ = auVar109._28_4_;
  auVar98 = vfmadd231ps_fma(auVar122,auVar121,auVar111);
  auVar14 = vfmadd231ps_fma(auVar120,auVar121,auVar116);
  auVar96 = vfmadd231ps_fma(auVar110,auVar118,auVar121);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar130,auVar113);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar130,auVar115);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar117,auVar130);
  auVar131._4_4_ = fVar213;
  auVar131._0_4_ = fVar213;
  auVar131._8_4_ = fVar213;
  auVar131._12_4_ = fVar213;
  auVar131._16_4_ = fVar213;
  auVar131._20_4_ = fVar213;
  auVar131._24_4_ = fVar213;
  auVar131._28_4_ = fVar213;
  auVar110 = ZEXT1632(CONCAT412(fVar214 * auVar237._12_4_,
                                CONCAT48(fVar214 * auVar237._8_4_,
                                         CONCAT44(fVar214 * auVar237._4_4_,fVar213))));
  auVar120 = vpermps_avx2(auVar132,auVar110);
  auVar110 = vpermps_avx512vl(auVar108,auVar110);
  fVar214 = auVar110._0_4_;
  fVar160 = auVar110._4_4_;
  auVar121._4_4_ = fVar160 * auVar114._4_4_;
  auVar121._0_4_ = fVar214 * auVar114._0_4_;
  fVar239 = auVar110._8_4_;
  auVar121._8_4_ = fVar239 * auVar114._8_4_;
  fVar240 = auVar110._12_4_;
  auVar121._12_4_ = fVar240 * auVar114._12_4_;
  fVar241 = auVar110._16_4_;
  auVar121._16_4_ = fVar241 * auVar114._16_4_;
  fVar244 = auVar110._20_4_;
  auVar121._20_4_ = fVar244 * auVar114._20_4_;
  fVar242 = auVar110._24_4_;
  auVar121._24_4_ = fVar242 * auVar114._24_4_;
  auVar121._28_4_ = 1;
  auVar108._4_4_ = auVar112._4_4_ * fVar160;
  auVar108._0_4_ = auVar112._0_4_ * fVar214;
  auVar108._8_4_ = auVar112._8_4_ * fVar239;
  auVar108._12_4_ = auVar112._12_4_ * fVar240;
  auVar108._16_4_ = auVar112._16_4_ * fVar241;
  auVar108._20_4_ = auVar112._20_4_ * fVar244;
  auVar108._24_4_ = auVar112._24_4_ * fVar242;
  auVar108._28_4_ = auVar114._28_4_;
  auVar112._4_4_ = auVar119._4_4_ * fVar160;
  auVar112._0_4_ = auVar119._0_4_ * fVar214;
  auVar112._8_4_ = auVar119._8_4_ * fVar239;
  auVar112._12_4_ = auVar119._12_4_ * fVar240;
  auVar112._16_4_ = auVar119._16_4_ * fVar241;
  auVar112._20_4_ = auVar119._20_4_ * fVar244;
  auVar112._24_4_ = auVar119._24_4_ * fVar242;
  auVar112._28_4_ = auVar110._28_4_;
  auVar100 = vfmadd231ps_fma(auVar121,auVar120,auVar111);
  auVar99 = vfmadd231ps_fma(auVar108,auVar120,auVar116);
  auVar97 = vfmadd231ps_fma(auVar112,auVar120,auVar118);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar131,auVar113);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar131,auVar115);
  auVar127._8_4_ = 0x7fffffff;
  auVar127._0_8_ = 0x7fffffff7fffffff;
  auVar127._12_4_ = 0x7fffffff;
  auVar127._16_4_ = 0x7fffffff;
  auVar127._20_4_ = 0x7fffffff;
  auVar127._24_4_ = 0x7fffffff;
  auVar127._28_4_ = 0x7fffffff;
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar131,auVar117);
  auVar113 = vandps_avx(ZEXT1632(auVar98),auVar127);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar129._16_4_ = 0x219392ef;
  auVar129._20_4_ = 0x219392ef;
  auVar129._24_4_ = 0x219392ef;
  auVar129._28_4_ = 0x219392ef;
  uVar94 = vcmpps_avx512vl(auVar113,auVar129,1);
  bVar7 = (bool)((byte)uVar94 & 1);
  auVar109._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar98._0_4_;
  bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar98._4_4_;
  bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar98._8_4_;
  bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar98._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar14),auVar127);
  uVar94 = vcmpps_avx512vl(auVar113,auVar129,1);
  bVar7 = (bool)((byte)uVar94 & 1);
  auVar123._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar14._0_4_;
  bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar14._4_4_;
  bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar14._8_4_;
  bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar14._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar96),auVar127);
  uVar94 = vcmpps_avx512vl(auVar113,auVar129,1);
  bVar7 = (bool)((byte)uVar94 & 1);
  auVar113._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar96._0_4_;
  bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar96._4_4_;
  bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar96._8_4_;
  bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar96._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar111 = vrcp14ps_avx512vl(auVar109);
  auVar128._8_4_ = 0x3f800000;
  auVar128._0_8_ = &DAT_3f8000003f800000;
  auVar128._12_4_ = 0x3f800000;
  auVar128._16_4_ = 0x3f800000;
  auVar128._20_4_ = 0x3f800000;
  auVar128._24_4_ = 0x3f800000;
  auVar128._28_4_ = 0x3f800000;
  auVar98 = vfnmadd213ps_fma(auVar109,auVar111,auVar128);
  auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar123);
  auVar14 = vfnmadd213ps_fma(auVar123,auVar111,auVar128);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar113);
  auVar96 = vfnmadd213ps_fma(auVar113,auVar111,auVar128);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar111,auVar111);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 7 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar100));
  auVar117._4_4_ = auVar98._4_4_ * auVar113._4_4_;
  auVar117._0_4_ = auVar98._0_4_ * auVar113._0_4_;
  auVar117._8_4_ = auVar98._8_4_ * auVar113._8_4_;
  auVar117._12_4_ = auVar98._12_4_ * auVar113._12_4_;
  auVar117._16_4_ = auVar113._16_4_ * 0.0;
  auVar117._20_4_ = auVar113._20_4_ * 0.0;
  auVar117._24_4_ = auVar113._24_4_ * 0.0;
  auVar117._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 9 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar100));
  auVar112 = vpbroadcastd_avx512vl();
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar126._0_4_ = auVar98._0_4_ * auVar113._0_4_;
  auVar126._4_4_ = auVar98._4_4_ * auVar113._4_4_;
  auVar126._8_4_ = auVar98._8_4_ * auVar113._8_4_;
  auVar126._12_4_ = auVar98._12_4_ * auVar113._12_4_;
  auVar126._16_4_ = auVar113._16_4_ * 0.0;
  auVar126._20_4_ = auVar113._20_4_ * 0.0;
  auVar126._24_4_ = auVar113._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar90 * -2 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar99));
  auVar118._4_4_ = auVar14._4_4_ * auVar113._4_4_;
  auVar118._0_4_ = auVar14._0_4_ * auVar113._0_4_;
  auVar118._8_4_ = auVar14._8_4_ * auVar113._8_4_;
  auVar118._12_4_ = auVar14._12_4_ * auVar113._12_4_;
  auVar118._16_4_ = auVar113._16_4_ * 0.0;
  auVar118._20_4_ = auVar113._20_4_ * 0.0;
  auVar118._24_4_ = auVar113._24_4_ * 0.0;
  auVar118._28_4_ = auVar113._28_4_;
  auVar113 = vcvtdq2ps_avx(auVar111);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar99));
  auVar125._0_4_ = auVar14._0_4_ * auVar113._0_4_;
  auVar125._4_4_ = auVar14._4_4_ * auVar113._4_4_;
  auVar125._8_4_ = auVar14._8_4_ * auVar113._8_4_;
  auVar125._12_4_ = auVar14._12_4_ * auVar113._12_4_;
  auVar125._16_4_ = auVar113._16_4_ * 0.0;
  auVar125._20_4_ = auVar113._20_4_ * 0.0;
  auVar125._24_4_ = auVar113._24_4_ * 0.0;
  auVar125._28_4_ = 0;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + uVar90 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar97));
  auVar119._4_4_ = auVar113._4_4_ * auVar96._4_4_;
  auVar119._0_4_ = auVar113._0_4_ * auVar96._0_4_;
  auVar119._8_4_ = auVar113._8_4_ * auVar96._8_4_;
  auVar119._12_4_ = auVar113._12_4_ * auVar96._12_4_;
  auVar119._16_4_ = auVar113._16_4_ * 0.0;
  auVar119._20_4_ = auVar113._20_4_ * 0.0;
  auVar119._24_4_ = auVar113._24_4_ * 0.0;
  auVar119._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x17 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar97));
  auVar124._0_4_ = auVar96._0_4_ * auVar113._0_4_;
  auVar124._4_4_ = auVar96._4_4_ * auVar113._4_4_;
  auVar124._8_4_ = auVar96._8_4_ * auVar113._8_4_;
  auVar124._12_4_ = auVar96._12_4_ * auVar113._12_4_;
  auVar124._16_4_ = auVar113._16_4_ * 0.0;
  auVar124._20_4_ = auVar113._20_4_ * 0.0;
  auVar124._24_4_ = auVar113._24_4_ * 0.0;
  auVar124._28_4_ = 0;
  auVar113 = vpminsd_avx2(auVar117,auVar126);
  auVar111 = vpminsd_avx2(auVar118,auVar125);
  auVar113 = vmaxps_avx(auVar113,auVar111);
  auVar111 = vpminsd_avx2(auVar119,auVar124);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar114._4_4_ = uVar161;
  auVar114._0_4_ = uVar161;
  auVar114._8_4_ = uVar161;
  auVar114._12_4_ = uVar161;
  auVar114._16_4_ = uVar161;
  auVar114._20_4_ = uVar161;
  auVar114._24_4_ = uVar161;
  auVar114._28_4_ = uVar161;
  auVar111 = vmaxps_avx512vl(auVar111,auVar114);
  auVar113 = vmaxps_avx(auVar113,auVar111);
  auVar111._8_4_ = 0x3f7ffffa;
  auVar111._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar111._12_4_ = 0x3f7ffffa;
  auVar111._16_4_ = 0x3f7ffffa;
  auVar111._20_4_ = 0x3f7ffffa;
  auVar111._24_4_ = 0x3f7ffffa;
  auVar111._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar113,auVar111);
  auVar113 = vpmaxsd_avx2(auVar117,auVar126);
  auVar111 = vpmaxsd_avx2(auVar118,auVar125);
  auVar113 = vminps_avx(auVar113,auVar111);
  auVar111 = vpmaxsd_avx2(auVar119,auVar124);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar161;
  auVar115._0_4_ = uVar161;
  auVar115._8_4_ = uVar161;
  auVar115._12_4_ = uVar161;
  auVar115._16_4_ = uVar161;
  auVar115._20_4_ = uVar161;
  auVar115._24_4_ = uVar161;
  auVar115._28_4_ = uVar161;
  auVar111 = vminps_avx512vl(auVar111,auVar115);
  auVar113 = vminps_avx(auVar113,auVar111);
  auVar116._8_4_ = 0x3f800003;
  auVar116._0_8_ = 0x3f8000033f800003;
  auVar116._12_4_ = 0x3f800003;
  auVar116._16_4_ = 0x3f800003;
  auVar116._20_4_ = 0x3f800003;
  auVar116._24_4_ = 0x3f800003;
  auVar116._28_4_ = 0x3f800003;
  auVar113 = vmulps_avx512vl(auVar113,auVar116);
  uVar17 = vpcmpgtd_avx512vl(auVar112,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_400,auVar113,2);
  if ((byte)((byte)uVar15 & (byte)uVar17) == 0) {
    return;
  }
  local_8e8 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  local_908 = (undefined1 (*) [32])&local_4a0;
  local_640 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_900 = prim;
LAB_01daf9f0:
  lVar92 = 0;
  for (uVar94 = local_8e8; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    lVar92 = lVar92 + 1;
  }
  uVar91 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar92 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar91].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar92 = *(long *)&pGVar4[1].time_range.upper;
  auVar98 = *(undefined1 (*) [16])(lVar92 + (long)p_Var5 * uVar94);
  auVar14 = *(undefined1 (*) [16])(lVar92 + (uVar94 + 1) * (long)p_Var5);
  local_8e8 = local_8e8 - 1 & local_8e8;
  if (local_8e8 != 0) {
    uVar90 = local_8e8 - 1 & local_8e8;
    for (uVar86 = local_8e8; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
    }
    if (uVar90 != 0) {
      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar100 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_8a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar268 = ZEXT3264(local_8a0);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar269 = ZEXT3264(local_8c0);
  auVar96 = vunpcklps_avx512vl(local_8a0._0_16_,local_8c0._0_16_);
  local_8e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar267 = ZEXT3264(local_8e0);
  auVar101 = local_8e0._0_16_;
  local_870 = vinsertps_avx512f(auVar96,auVar101,0x28);
  auVar255 = ZEXT1664(local_870);
  auVar237._0_4_ = auVar98._0_4_ + auVar14._0_4_;
  auVar237._4_4_ = auVar98._4_4_ + auVar14._4_4_;
  auVar237._8_4_ = auVar98._8_4_ + auVar14._8_4_;
  auVar237._12_4_ = auVar98._12_4_ + auVar14._12_4_;
  auVar103._8_4_ = 0x3f000000;
  auVar103._0_8_ = 0x3f0000003f000000;
  auVar103._12_4_ = 0x3f000000;
  auVar96 = vmulps_avx512vl(auVar237,auVar103);
  auVar96 = vsubps_avx(auVar96,auVar100);
  auVar96 = vdpps_avx(auVar96,local_870,0x7f);
  fVar214 = *(float *)(ray + k * 4 + 0x60);
  local_880 = vdpps_avx(local_870,local_870,0x7f);
  auVar261 = ZEXT1664(local_880);
  auVar105._4_12_ = ZEXT812(0) << 0x20;
  auVar105._0_4_ = local_880._0_4_;
  auVar97 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar105);
  auVar99 = vfnmadd213ss_fma(auVar97,local_880,ZEXT416(0x40000000));
  local_3e0 = auVar96._0_4_ * auVar97._0_4_ * auVar99._0_4_;
  auVar104._4_4_ = local_3e0;
  auVar104._0_4_ = local_3e0;
  auVar104._8_4_ = local_3e0;
  auVar104._12_4_ = local_3e0;
  fStack_730 = local_3e0;
  _local_740 = auVar104;
  fStack_72c = local_3e0;
  fStack_728 = local_3e0;
  fStack_724 = local_3e0;
  auVar96 = vfmadd231ps_fma(auVar100,local_870,auVar104);
  auVar96 = vblendps_avx(auVar96,ZEXT816(0) << 0x40,8);
  auVar98 = vsubps_avx(auVar98,auVar96);
  auVar100 = vsubps_avx(*(undefined1 (*) [16])(lVar92 + (uVar94 + 2) * (long)p_Var5),auVar96);
  auVar14 = vsubps_avx(auVar14,auVar96);
  auVar252 = ZEXT1664(auVar14);
  auVar96 = vsubps_avx(*(undefined1 (*) [16])(lVar92 + (uVar94 + 3) * (long)p_Var5),auVar96);
  auVar227 = ZEXT1664(auVar96);
  local_5a0 = auVar98._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  auVar137._8_4_ = 1;
  auVar137._0_8_ = 0x100000001;
  auVar137._12_4_ = 1;
  auVar137._16_4_ = 1;
  auVar137._20_4_ = 1;
  auVar137._24_4_ = 1;
  auVar137._28_4_ = 1;
  local_800 = ZEXT1632(auVar98);
  local_1e0 = vpermps_avx2(auVar137,local_800);
  auVar138._8_4_ = 2;
  auVar138._0_8_ = 0x200000002;
  auVar138._12_4_ = 2;
  auVar138._16_4_ = 2;
  auVar138._20_4_ = 2;
  auVar138._24_4_ = 2;
  auVar138._28_4_ = 2;
  local_200 = vpermps_avx2(auVar138,local_800);
  auVar139._8_4_ = 3;
  auVar139._0_8_ = 0x300000003;
  auVar139._12_4_ = 3;
  auVar139._16_4_ = 3;
  auVar139._20_4_ = 3;
  auVar139._24_4_ = 3;
  auVar139._28_4_ = 3;
  local_220 = vpermps_avx2(auVar139,local_800);
  local_240 = auVar14._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_840 = ZEXT1632(auVar14);
  local_260 = vpermps_avx2(auVar137,local_840);
  local_280 = vpermps_avx2(auVar138,local_840);
  local_2a0 = vpermps_avx2(auVar139,local_840);
  local_2c0 = auVar100._0_4_;
  uStack_2bc = local_2c0;
  uStack_2b8 = local_2c0;
  uStack_2b4 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2ac = local_2c0;
  uStack_2a8 = local_2c0;
  uStack_2a4 = local_2c0;
  local_820 = ZEXT1632(auVar100);
  local_2e0 = vpermps_avx2(auVar137,local_820);
  local_300 = vpermps_avx2(auVar138,local_820);
  local_320 = vpermps_avx2(auVar139,local_820);
  local_340 = auVar96._0_4_;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  _local_860 = ZEXT1632(auVar96);
  _local_360 = vpermps_avx2(auVar137,_local_860);
  local_380 = vpermps_avx2(auVar138,_local_860);
  _local_3a0 = vpermps_avx2(auVar139,_local_860);
  auVar98 = vmulss_avx512f(auVar101,auVar101);
  auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),local_8c0,local_8c0);
  local_5c0 = vfmadd231ps_avx512vl(auVar113,local_8a0,local_8a0);
  local_3c0._0_4_ = local_5c0._0_4_;
  local_3c0._4_4_ = local_3c0._0_4_;
  local_3c0._8_4_ = local_3c0._0_4_;
  local_3c0._12_4_ = local_3c0._0_4_;
  local_3c0._16_4_ = local_3c0._0_4_;
  local_3c0._20_4_ = local_3c0._0_4_;
  local_3c0._24_4_ = local_3c0._0_4_;
  local_3c0._28_4_ = local_3c0._0_4_;
  auVar136._8_4_ = 0x7fffffff;
  auVar136._0_8_ = 0x7fffffff7fffffff;
  auVar136._12_4_ = 0x7fffffff;
  auVar136._16_4_ = 0x7fffffff;
  auVar136._20_4_ = 0x7fffffff;
  auVar136._24_4_ = 0x7fffffff;
  auVar136._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3c0,auVar136);
  local_7a0 = ZEXT416((uint)local_3e0);
  local_3e0 = fVar214 - local_3e0;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_600 = vpbroadcastd_avx512vl();
  local_8f8 = 1;
  local_8f0 = 0;
  local_620 = vpbroadcastd_avx512vl();
  auVar98 = vsqrtss_avx(local_880,local_880);
  auVar14 = vsqrtss_avx(local_880,local_880);
  auVar212 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar266 = ZEXT3264(auVar113);
  do {
    local_920 = auVar212._0_16_;
    auVar96 = vmovshdup_avx(local_920);
    fVar239 = auVar212._0_4_;
    fVar160 = auVar96._0_4_ - fVar239;
    fVar244 = fVar160 * 0.04761905;
    auVar232._4_4_ = fVar239;
    auVar232._0_4_ = fVar239;
    auVar232._8_4_ = fVar239;
    auVar232._12_4_ = fVar239;
    auVar232._16_4_ = fVar239;
    auVar232._20_4_ = fVar239;
    auVar232._24_4_ = fVar239;
    auVar232._28_4_ = fVar239;
    auVar169._4_4_ = fVar160;
    auVar169._0_4_ = fVar160;
    auVar169._8_4_ = fVar160;
    auVar169._12_4_ = fVar160;
    auVar169._16_4_ = fVar160;
    auVar169._20_4_ = fVar160;
    auVar169._24_4_ = fVar160;
    auVar169._28_4_ = fVar160;
    auVar96 = vfmadd231ps_fma(auVar232,auVar169,_DAT_02020f20);
    auVar111 = vsubps_avx512vl(auVar266._0_32_,ZEXT1632(auVar96));
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar114 = vxorps_avx512vl(ZEXT1632(auVar96),auVar113);
    fVar242 = auVar111._0_4_;
    fVar243 = auVar111._4_4_;
    fVar213 = auVar111._8_4_;
    fVar248 = auVar111._12_4_;
    fVar245 = auVar111._16_4_;
    fVar249 = auVar111._20_4_;
    fVar250 = auVar111._24_4_;
    auVar40._4_4_ = fVar243 * fVar243 * auVar114._4_4_;
    auVar40._0_4_ = fVar242 * fVar242 * auVar114._0_4_;
    auVar40._8_4_ = fVar213 * fVar213 * auVar114._8_4_;
    auVar40._12_4_ = fVar248 * fVar248 * auVar114._12_4_;
    auVar40._16_4_ = fVar245 * fVar245 * auVar114._16_4_;
    auVar40._20_4_ = fVar249 * fVar249 * auVar114._20_4_;
    auVar40._24_4_ = fVar250 * fVar250 * auVar114._24_4_;
    auVar40._28_4_ = auVar114._28_4_;
    fVar160 = auVar96._0_4_;
    fVar239 = auVar96._4_4_;
    fVar240 = auVar96._8_4_;
    fVar241 = auVar96._12_4_;
    auVar212._28_36_ = auVar227._28_36_;
    auVar212._0_28_ =
         ZEXT1628(CONCAT412(fVar241 * fVar241,
                            CONCAT48(fVar240 * fVar240,CONCAT44(fVar239 * fVar239,fVar160 * fVar160)
                                    )));
    fVar253 = fVar160 * 3.0;
    fVar256 = fVar239 * 3.0;
    fVar257 = fVar240 * 3.0;
    fVar258 = fVar241 * 3.0;
    auVar227._28_36_ = auVar255._28_36_;
    auVar227._0_28_ = ZEXT1628(CONCAT412(fVar258,CONCAT48(fVar257,CONCAT44(fVar256,fVar253))));
    auVar193._0_4_ = (fVar253 + -5.0) * fVar160 * fVar160 + 2.0;
    auVar193._4_4_ = (fVar256 + -5.0) * fVar239 * fVar239 + 2.0;
    auVar193._8_4_ = (fVar257 + -5.0) * fVar240 * fVar240 + 2.0;
    auVar193._12_4_ = (fVar258 + -5.0) * fVar241 * fVar241 + 2.0;
    auVar193._16_4_ = 0x40000000;
    auVar193._20_4_ = 0x40000000;
    auVar193._24_4_ = 0x40000000;
    auVar193._28_4_ = 0x40000000;
    auVar266._0_4_ = fVar242 * fVar242;
    auVar266._4_4_ = fVar243 * fVar243;
    auVar266._8_4_ = fVar213 * fVar213;
    auVar266._12_4_ = fVar248 * fVar248;
    auVar266._16_4_ = fVar245 * fVar245;
    auVar266._20_4_ = fVar249 * fVar249;
    auVar266._28_36_ = auVar261._28_36_;
    auVar266._24_4_ = fVar250 * fVar250;
    auVar208._0_4_ = auVar266._0_4_ * (fVar242 * 3.0 + -5.0) + 2.0;
    auVar208._4_4_ = auVar266._4_4_ * (fVar243 * 3.0 + -5.0) + 2.0;
    auVar208._8_4_ = auVar266._8_4_ * (fVar213 * 3.0 + -5.0) + 2.0;
    auVar208._12_4_ = auVar266._12_4_ * (fVar248 * 3.0 + -5.0) + 2.0;
    auVar208._16_4_ = auVar266._16_4_ * (fVar245 * 3.0 + -5.0) + 2.0;
    auVar208._20_4_ = auVar266._20_4_ * (fVar249 * 3.0 + -5.0) + 2.0;
    auVar208._24_4_ = auVar266._24_4_ * (fVar250 * 3.0 + -5.0) + 2.0;
    auVar208._28_4_ = auVar252._28_4_ + -5.0 + 2.0;
    auVar113 = vxorps_avx512vl(auVar111,auVar113);
    auVar41._4_4_ = fVar239 * fVar239 * auVar113._4_4_;
    auVar41._0_4_ = fVar160 * fVar160 * auVar113._0_4_;
    auVar41._8_4_ = fVar240 * fVar240 * auVar113._8_4_;
    auVar41._12_4_ = fVar241 * fVar241 * auVar113._12_4_;
    auVar41._16_4_ = auVar113._16_4_ * 0.0 * 0.0;
    auVar41._20_4_ = auVar113._20_4_ * 0.0 * 0.0;
    auVar41._24_4_ = auVar113._24_4_ * 0.0 * 0.0;
    auVar41._28_4_ = auVar113._28_4_;
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar113 = vmulps_avx512vl(auVar40,auVar115);
    auVar116 = vmulps_avx512vl(auVar193,auVar115);
    auVar112 = vmulps_avx512vl(auVar208,auVar115);
    auVar117 = vmulps_avx512vl(auVar41,auVar115);
    auVar80._4_4_ = uStack_33c;
    auVar80._0_4_ = local_340;
    auVar80._8_4_ = uStack_338;
    auVar80._12_4_ = uStack_334;
    auVar80._16_4_ = uStack_330;
    auVar80._20_4_ = uStack_32c;
    auVar80._24_4_ = uStack_328;
    auVar80._28_4_ = uStack_324;
    auVar118 = vmulps_avx512vl(auVar80,auVar117);
    auVar42._4_4_ = (float)local_360._4_4_ * auVar117._4_4_;
    auVar42._0_4_ = (float)local_360._0_4_ * auVar117._0_4_;
    auVar42._8_4_ = fStack_358 * auVar117._8_4_;
    auVar42._12_4_ = fStack_354 * auVar117._12_4_;
    auVar42._16_4_ = fStack_350 * auVar117._16_4_;
    auVar42._20_4_ = fStack_34c * auVar117._20_4_;
    auVar42._24_4_ = fStack_348 * auVar117._24_4_;
    auVar42._28_4_ = auVar114._28_4_;
    auVar114 = vmulps_avx512vl(local_380,auVar117);
    auVar43._4_4_ = (float)local_3a0._4_4_ * auVar117._4_4_;
    auVar43._0_4_ = (float)local_3a0._0_4_ * auVar117._0_4_;
    auVar43._8_4_ = fStack_398 * auVar117._8_4_;
    auVar43._12_4_ = fStack_394 * auVar117._12_4_;
    auVar43._16_4_ = fStack_390 * auVar117._16_4_;
    auVar43._20_4_ = fStack_38c * auVar117._20_4_;
    auVar43._24_4_ = fStack_388 * auVar117._24_4_;
    auVar43._28_4_ = auVar117._28_4_;
    auVar81._4_4_ = uStack_2bc;
    auVar81._0_4_ = local_2c0;
    auVar81._8_4_ = uStack_2b8;
    auVar81._12_4_ = uStack_2b4;
    auVar81._16_4_ = uStack_2b0;
    auVar81._20_4_ = uStack_2ac;
    auVar81._24_4_ = uStack_2a8;
    auVar81._28_4_ = uStack_2a4;
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar112,auVar81);
    auVar118 = vfmadd231ps_avx512vl(auVar42,auVar112,local_2e0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,local_300);
    auVar112 = vfmadd231ps_avx512vl(auVar43,local_320,auVar112);
    auVar82._4_4_ = uStack_23c;
    auVar82._0_4_ = local_240;
    auVar82._8_4_ = uStack_238;
    auVar82._12_4_ = uStack_234;
    auVar82._16_4_ = uStack_230;
    auVar82._20_4_ = uStack_22c;
    auVar82._24_4_ = uStack_228;
    auVar82._28_4_ = uStack_224;
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar82);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_260);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_280);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_2a0,auVar116);
    auVar77._4_4_ = uStack_59c;
    auVar77._0_4_ = local_5a0;
    auVar77._8_4_ = uStack_598;
    auVar77._12_4_ = uStack_594;
    auVar77._16_4_ = uStack_590;
    auVar77._20_4_ = uStack_58c;
    auVar77._24_4_ = uStack_588;
    auVar77._28_4_ = uStack_584;
    auVar96 = vfmadd231ps_fma(auVar117,auVar113,auVar77);
    auVar100 = vfmadd231ps_fma(auVar118,auVar113,local_1e0);
    local_940 = vfmadd231ps_avx512vl(auVar114,auVar113,local_200);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_220,auVar113);
    auVar44._4_4_ = (fVar243 + fVar243) * fVar239;
    auVar44._0_4_ = (fVar242 + fVar242) * fVar160;
    auVar44._8_4_ = (fVar213 + fVar213) * fVar240;
    auVar44._12_4_ = (fVar248 + fVar248) * fVar241;
    auVar44._16_4_ = (fVar245 + fVar245) * 0.0;
    auVar44._20_4_ = (fVar249 + fVar249) * 0.0;
    auVar44._24_4_ = (fVar250 + fVar250) * 0.0;
    auVar44._28_4_ = auVar116._28_4_;
    auVar113 = vsubps_avx(auVar44,auVar266._0_32_);
    auVar233._0_28_ =
         ZEXT1628(CONCAT412((fVar241 + fVar241) * (fVar258 + -5.0) + fVar258 * fVar241,
                            CONCAT48((fVar240 + fVar240) * (fVar257 + -5.0) + fVar257 * fVar240,
                                     CONCAT44((fVar239 + fVar239) * (fVar256 + -5.0) +
                                              fVar256 * fVar239,
                                              (fVar160 + fVar160) * (fVar253 + -5.0) +
                                              fVar253 * fVar160))));
    auVar233._28_4_ = auVar255._28_4_ + -5.0 + 0.0;
    auVar23._8_4_ = 0x40000000;
    auVar23._0_8_ = 0x4000000040000000;
    auVar23._12_4_ = 0x40000000;
    auVar23._16_4_ = 0x40000000;
    auVar23._20_4_ = 0x40000000;
    auVar23._24_4_ = 0x40000000;
    auVar23._28_4_ = 0x40000000;
    auVar114 = vaddps_avx512vl(auVar227._0_32_,auVar23);
    auVar45._4_4_ = (fVar243 + fVar243) * auVar114._4_4_;
    auVar45._0_4_ = (fVar242 + fVar242) * auVar114._0_4_;
    auVar45._8_4_ = (fVar213 + fVar213) * auVar114._8_4_;
    auVar45._12_4_ = (fVar248 + fVar248) * auVar114._12_4_;
    auVar45._16_4_ = (fVar245 + fVar245) * auVar114._16_4_;
    auVar45._20_4_ = (fVar249 + fVar249) * auVar114._20_4_;
    auVar45._24_4_ = (fVar250 + fVar250) * auVar114._24_4_;
    auVar45._28_4_ = auVar114._28_4_;
    auVar46._4_4_ = fVar243 * 3.0 * fVar243;
    auVar46._0_4_ = fVar242 * 3.0 * fVar242;
    auVar46._8_4_ = fVar213 * 3.0 * fVar213;
    auVar46._12_4_ = fVar248 * 3.0 * fVar248;
    auVar46._16_4_ = fVar245 * 3.0 * fVar245;
    auVar46._20_4_ = fVar249 * 3.0 * fVar249;
    auVar46._24_4_ = fVar250 * 3.0 * fVar250;
    auVar46._28_4_ = auVar111._28_4_;
    auVar111 = vsubps_avx(auVar45,auVar46);
    auVar114 = vsubps_avx(auVar212._0_32_,auVar44);
    auVar116 = vmulps_avx512vl(auVar113,auVar115);
    auVar117 = vmulps_avx512vl(auVar233,auVar115);
    auVar111 = vmulps_avx512vl(auVar111,auVar115);
    auVar114 = vmulps_avx512vl(auVar114,auVar115);
    auVar115 = vmulps_avx512vl(auVar80,auVar114);
    auVar47._4_4_ = (float)local_360._4_4_ * auVar114._4_4_;
    auVar47._0_4_ = (float)local_360._0_4_ * auVar114._0_4_;
    auVar47._8_4_ = fStack_358 * auVar114._8_4_;
    auVar47._12_4_ = fStack_354 * auVar114._12_4_;
    auVar47._16_4_ = fStack_350 * auVar114._16_4_;
    auVar47._20_4_ = fStack_34c * auVar114._20_4_;
    auVar47._24_4_ = fStack_348 * auVar114._24_4_;
    auVar47._28_4_ = uStack_344;
    auVar118 = vmulps_avx512vl(local_380,auVar114);
    auVar48._4_4_ = auVar114._4_4_ * (float)local_3a0._4_4_;
    auVar48._0_4_ = auVar114._0_4_ * (float)local_3a0._0_4_;
    auVar48._8_4_ = auVar114._8_4_ * fStack_398;
    auVar48._12_4_ = auVar114._12_4_ * fStack_394;
    auVar48._16_4_ = auVar114._16_4_ * fStack_390;
    auVar48._20_4_ = auVar114._20_4_ * fStack_38c;
    auVar48._24_4_ = auVar114._24_4_ * fStack_388;
    auVar48._28_4_ = auVar114._28_4_;
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar81);
    auVar115 = vfmadd231ps_avx512vl(auVar47,auVar111,local_2e0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_300);
    auVar111 = vfmadd231ps_avx512vl(auVar48,local_320,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar82);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_260);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,local_280);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_2a0,auVar117);
    auVar78._4_4_ = uStack_59c;
    auVar78._0_4_ = local_5a0;
    auVar78._8_4_ = uStack_598;
    auVar78._12_4_ = uStack_594;
    auVar78._16_4_ = uStack_590;
    auVar78._20_4_ = uStack_58c;
    auVar78._24_4_ = uStack_588;
    auVar78._28_4_ = uStack_584;
    auVar99 = vfmadd231ps_fma(auVar114,auVar116,auVar78);
    auVar97 = vfmadd231ps_fma(auVar115,auVar116,local_1e0);
    auVar114 = vfmadd231ps_avx512vl(auVar118,auVar116,local_200);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_220,auVar116);
    auVar49._4_4_ = auVar99._4_4_ * fVar244;
    auVar49._0_4_ = auVar99._0_4_ * fVar244;
    auVar49._8_4_ = auVar99._8_4_ * fVar244;
    auVar49._12_4_ = auVar99._12_4_ * fVar244;
    auVar49._16_4_ = fVar244 * 0.0;
    auVar49._20_4_ = fVar244 * 0.0;
    auVar49._24_4_ = fVar244 * 0.0;
    auVar49._28_4_ = auVar113._28_4_;
    auVar261 = ZEXT3264(auVar49);
    auVar262._0_4_ = auVar97._0_4_ * fVar244;
    auVar262._4_4_ = auVar97._4_4_ * fVar244;
    auVar262._8_4_ = auVar97._8_4_ * fVar244;
    auVar262._12_4_ = auVar97._12_4_ * fVar244;
    auVar262._16_4_ = fVar244 * 0.0;
    auVar262._20_4_ = fVar244 * 0.0;
    auVar262._24_4_ = fVar244 * 0.0;
    auVar262._28_4_ = 0;
    auVar50._4_4_ = auVar114._4_4_ * fVar244;
    auVar50._0_4_ = auVar114._0_4_ * fVar244;
    auVar50._8_4_ = auVar114._8_4_ * fVar244;
    auVar50._12_4_ = auVar114._12_4_ * fVar244;
    auVar50._16_4_ = auVar114._16_4_ * fVar244;
    auVar50._20_4_ = auVar114._20_4_ * fVar244;
    auVar50._24_4_ = auVar114._24_4_ * fVar244;
    auVar50._28_4_ = auVar114._28_4_;
    fVar160 = auVar111._0_4_ * fVar244;
    fVar239 = auVar111._4_4_ * fVar244;
    auVar51._4_4_ = fVar239;
    auVar51._0_4_ = fVar160;
    fVar240 = auVar111._8_4_ * fVar244;
    auVar51._8_4_ = fVar240;
    fVar241 = auVar111._12_4_ * fVar244;
    auVar51._12_4_ = fVar241;
    fVar242 = auVar111._16_4_ * fVar244;
    auVar51._16_4_ = fVar242;
    fVar243 = auVar111._20_4_ * fVar244;
    auVar51._20_4_ = fVar243;
    fVar244 = auVar111._24_4_ * fVar244;
    auVar51._24_4_ = fVar244;
    auVar51._28_4_ = fStack_384;
    auVar133 = auVar269._0_32_;
    auVar99 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
    auVar117 = vpermt2ps_avx512vl(ZEXT1632(auVar96),_DAT_0205fd20,ZEXT1632(auVar99));
    auVar118 = vpermt2ps_avx512vl(ZEXT1632(auVar100),_DAT_0205fd20,ZEXT1632(auVar99));
    auVar255 = ZEXT3264(auVar118);
    auVar114 = ZEXT1632(auVar99);
    auVar119 = vpermt2ps_avx512vl(local_940,_DAT_0205fd20,auVar114);
    auVar234._0_4_ = auVar112._0_4_ + fVar160;
    auVar234._4_4_ = auVar112._4_4_ + fVar239;
    auVar234._8_4_ = auVar112._8_4_ + fVar240;
    auVar234._12_4_ = auVar112._12_4_ + fVar241;
    auVar234._16_4_ = auVar112._16_4_ + fVar242;
    auVar234._20_4_ = auVar112._20_4_ + fVar243;
    auVar234._24_4_ = auVar112._24_4_ + fVar244;
    auVar234._28_4_ = auVar112._28_4_ + fStack_384;
    auVar113 = vmaxps_avx(auVar112,auVar234);
    auVar111 = vminps_avx(auVar112,auVar234);
    auVar112 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,auVar114);
    auVar120 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar114);
    auVar110 = vpermt2ps_avx512vl(auVar262,_DAT_0205fd20,auVar114);
    auVar131 = ZEXT1632(auVar99);
    auVar121 = vpermt2ps_avx512vl(auVar50,_DAT_0205fd20,auVar131);
    auVar114 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,auVar131);
    auVar122 = vsubps_avx512vl(auVar112,auVar114);
    auVar114 = vsubps_avx(auVar117,ZEXT1632(auVar96));
    auVar115 = vsubps_avx(auVar118,ZEXT1632(auVar100));
    auVar108 = vsubps_avx512vl(auVar119,local_940);
    auVar116 = vmulps_avx512vl(auVar115,auVar50);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar262,auVar108);
    auVar109 = vmulps_avx512vl(auVar108,auVar49);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar50,auVar114);
    auVar123 = vmulps_avx512vl(auVar114,auVar262);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar49,auVar115);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar109 = vfmadd231ps_avx512vl(auVar123,auVar109,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar108,auVar108);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar123 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar114);
    auVar124 = vrcp14ps_avx512vl(auVar123);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar252 = ZEXT3264(auVar116);
    auVar125 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar116);
    auVar124 = vfmadd132ps_avx512vl(auVar125,auVar124,auVar124);
    auVar109 = vmulps_avx512vl(auVar109,auVar124);
    auVar125 = vmulps_avx512vl(auVar115,auVar121);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar110,auVar108);
    auVar126 = vmulps_avx512vl(auVar108,auVar120);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar121,auVar114);
    auVar127 = vmulps_avx512vl(auVar114,auVar110);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar115);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar124 = vmulps_avx512vl(auVar125,auVar124);
    auVar109 = vmaxps_avx512vl(auVar109,auVar124);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar124 = vmaxps_avx512vl(auVar122,auVar112);
    auVar113 = vmaxps_avx512vl(auVar113,auVar124);
    auVar124 = vaddps_avx512vl(auVar109,auVar113);
    auVar113 = vminps_avx512vl(auVar122,auVar112);
    auVar113 = vminps_avx(auVar111,auVar113);
    auVar113 = vsubps_avx512vl(auVar113,auVar109);
    auVar24._8_4_ = 0x3f800002;
    auVar24._0_8_ = 0x3f8000023f800002;
    auVar24._12_4_ = 0x3f800002;
    auVar24._16_4_ = 0x3f800002;
    auVar24._20_4_ = 0x3f800002;
    auVar24._24_4_ = 0x3f800002;
    auVar24._28_4_ = 0x3f800002;
    auVar111 = vmulps_avx512vl(auVar124,auVar24);
    auVar25._8_4_ = 0x3f7ffffc;
    auVar25._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar25._12_4_ = 0x3f7ffffc;
    auVar25._16_4_ = 0x3f7ffffc;
    auVar25._20_4_ = 0x3f7ffffc;
    auVar25._24_4_ = 0x3f7ffffc;
    auVar25._28_4_ = 0x3f7ffffc;
    auVar112 = vmulps_avx512vl(auVar113,auVar25);
    auVar52._4_4_ = auVar111._4_4_ * auVar111._4_4_;
    auVar52._0_4_ = auVar111._0_4_ * auVar111._0_4_;
    auVar52._8_4_ = auVar111._8_4_ * auVar111._8_4_;
    auVar52._12_4_ = auVar111._12_4_ * auVar111._12_4_;
    auVar52._16_4_ = auVar111._16_4_ * auVar111._16_4_;
    auVar52._20_4_ = auVar111._20_4_ * auVar111._20_4_;
    auVar52._24_4_ = auVar111._24_4_ * auVar111._24_4_;
    auVar52._28_4_ = auVar112._28_4_;
    auVar113 = vrsqrt14ps_avx512vl(auVar123);
    auVar26._8_4_ = 0xbf000000;
    auVar26._0_8_ = 0xbf000000bf000000;
    auVar26._12_4_ = 0xbf000000;
    auVar26._16_4_ = 0xbf000000;
    auVar26._20_4_ = 0xbf000000;
    auVar26._24_4_ = 0xbf000000;
    auVar26._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar123,auVar26);
    auVar53._4_4_ = auVar113._4_4_ * auVar111._4_4_;
    auVar53._0_4_ = auVar113._0_4_ * auVar111._0_4_;
    auVar53._8_4_ = auVar113._8_4_ * auVar111._8_4_;
    auVar53._12_4_ = auVar113._12_4_ * auVar111._12_4_;
    auVar53._16_4_ = auVar113._16_4_ * auVar111._16_4_;
    auVar53._20_4_ = auVar113._20_4_ * auVar111._20_4_;
    auVar53._24_4_ = auVar113._24_4_ * auVar111._24_4_;
    auVar53._28_4_ = auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar113,auVar113);
    auVar111 = vmulps_avx512vl(auVar111,auVar53);
    auVar27._8_4_ = 0x3fc00000;
    auVar27._0_8_ = 0x3fc000003fc00000;
    auVar27._12_4_ = 0x3fc00000;
    auVar27._16_4_ = 0x3fc00000;
    auVar27._20_4_ = 0x3fc00000;
    auVar27._24_4_ = 0x3fc00000;
    auVar27._28_4_ = 0x3fc00000;
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar27);
    auVar54._4_4_ = auVar111._4_4_ * auVar114._4_4_;
    auVar54._0_4_ = auVar111._0_4_ * auVar114._0_4_;
    auVar54._8_4_ = auVar111._8_4_ * auVar114._8_4_;
    auVar54._12_4_ = auVar111._12_4_ * auVar114._12_4_;
    auVar54._16_4_ = auVar111._16_4_ * auVar114._16_4_;
    auVar54._20_4_ = auVar111._20_4_ * auVar114._20_4_;
    auVar54._24_4_ = auVar111._24_4_ * auVar114._24_4_;
    auVar54._28_4_ = auVar113._28_4_;
    auVar113 = vmulps_avx512vl(auVar115,auVar111);
    auVar122 = vmulps_avx512vl(auVar108,auVar111);
    local_960 = ZEXT1632(auVar96);
    auVar109 = vsubps_avx512vl(auVar131,local_960);
    local_6e0 = ZEXT1632(auVar100);
    auVar123 = vsubps_avx512vl(auVar131,local_6e0);
    auVar124 = vsubps_avx512vl(auVar131,local_940);
    auVar125 = vmulps_avx512vl(auVar267._0_32_,auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar133,auVar123);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar268._0_32_,auVar109);
    auVar126 = vmulps_avx512vl(auVar124,auVar124);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar123,auVar123);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar109,auVar109);
    auVar127 = vmulps_avx512vl(auVar267._0_32_,auVar122);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar113,auVar133);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar54,auVar268._0_32_);
    auVar122 = vmulps_avx512vl(auVar124,auVar122);
    auVar113 = vfmadd231ps_avx512vl(auVar122,auVar123,auVar113);
    auVar122 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar54);
    local_720 = vmulps_avx512vl(auVar127,auVar127);
    auVar113 = vsubps_avx(local_3c0,local_720);
    auVar128 = vmulps_avx512vl(auVar127,auVar122);
    auVar125 = vsubps_avx512vl(auVar125,auVar128);
    auVar125 = vaddps_avx512vl(auVar125,auVar125);
    auVar128 = vmulps_avx512vl(auVar122,auVar122);
    local_700 = vsubps_avx512vl(auVar126,auVar128);
    auVar126 = vsubps_avx512vl(local_700,auVar52);
    auVar128 = vmulps_avx512vl(auVar125,auVar125);
    auVar28._8_4_ = 0x40800000;
    auVar28._0_8_ = 0x4080000040800000;
    auVar28._12_4_ = 0x40800000;
    auVar28._16_4_ = 0x40800000;
    auVar28._20_4_ = 0x40800000;
    auVar28._24_4_ = 0x40800000;
    auVar28._28_4_ = 0x40800000;
    auVar129 = vmulps_avx512vl(auVar113,auVar28);
    auVar130 = vmulps_avx512vl(auVar129,auVar126);
    auVar130 = vsubps_avx512vl(auVar128,auVar130);
    uVar94 = vcmpps_avx512vl(auVar130,auVar131,5);
    bVar83 = (byte)uVar94;
    if (bVar83 == 0) {
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar130 = vsqrtps_avx512vl(auVar130);
      auVar131 = vaddps_avx512vl(auVar113,auVar113);
      auVar132 = vrcp14ps_avx512vl(auVar131);
      auVar116 = vfnmadd213ps_avx512vl(auVar131,auVar132,auVar116);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar132,auVar132);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar131 = vxorps_avx512vl(auVar125,auVar29);
      auVar131 = vsubps_avx512vl(auVar131,auVar130);
      auVar131 = vmulps_avx512vl(auVar131,auVar116);
      auVar130 = vsubps_avx512vl(auVar130,auVar125);
      auVar116 = vmulps_avx512vl(auVar130,auVar116);
      auVar130 = vfmadd213ps_avx512vl(auVar127,auVar131,auVar122);
      local_660 = vmulps_avx512vl(auVar111,auVar130);
      auVar130 = vfmadd213ps_avx512vl(auVar127,auVar116,auVar122);
      local_680 = vmulps_avx512vl(auVar111,auVar130);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130 = vblendmps_avx512vl(auVar130,auVar131);
      auVar134._0_4_ =
           (uint)(bVar83 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar83 & 1) * local_680._0_4_;
      bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * local_680._4_4_;
      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * local_680._8_4_;
      bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * local_680._12_4_;
      bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * local_680._16_4_;
      bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * local_680._20_4_;
      bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * local_680._24_4_;
      bVar7 = SUB81(uVar94 >> 7,0);
      auVar134._28_4_ = (uint)bVar7 * auVar130._28_4_ | (uint)!bVar7 * local_680._28_4_;
      auVar221._8_4_ = 0xff800000;
      auVar221._0_8_ = 0xff800000ff800000;
      auVar221._12_4_ = 0xff800000;
      auVar221._16_4_ = 0xff800000;
      auVar221._20_4_ = 0xff800000;
      auVar221._24_4_ = 0xff800000;
      auVar221._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar221,auVar116);
      auVar135._0_4_ =
           (uint)(bVar83 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar116._0_4_;
      bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * auVar116._4_4_;
      bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * auVar116._8_4_;
      bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar116._12_4_;
      bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
      auVar135._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * auVar116._16_4_;
      bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
      auVar135._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * auVar116._20_4_;
      bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
      auVar135._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * auVar116._24_4_;
      bVar7 = SUB81(uVar94 >> 7,0);
      auVar135._28_4_ = (uint)bVar7 * auVar130._28_4_ | (uint)!bVar7 * auVar116._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_720,auVar130);
      auVar116 = vmaxps_avx(local_5c0,auVar130);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar133 = vmulps_avx512vl(auVar116,auVar30);
      vandps_avx512vl(auVar113,auVar130);
      uVar86 = vcmpps_avx512vl(auVar133,auVar133,1);
      uVar94 = uVar94 & uVar86;
      bVar89 = (byte)uVar94;
      if (bVar89 != 0) {
        uVar86 = vcmpps_avx512vl(auVar126,_DAT_02020f00,2);
        auVar236._8_4_ = 0xff800000;
        auVar236._0_8_ = 0xff800000ff800000;
        auVar236._12_4_ = 0xff800000;
        auVar236._16_4_ = 0xff800000;
        auVar236._20_4_ = 0xff800000;
        auVar236._24_4_ = 0xff800000;
        auVar236._28_4_ = 0xff800000;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126 = vblendmps_avx512vl(auVar116,auVar236);
        bVar87 = (byte)uVar86;
        uVar95 = (uint)(bVar87 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar133._0_4_;
        bVar7 = (bool)((byte)(uVar86 >> 1) & 1);
        uVar153 = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * auVar133._4_4_;
        bVar7 = (bool)((byte)(uVar86 >> 2) & 1);
        uVar154 = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * auVar133._8_4_;
        bVar7 = (bool)((byte)(uVar86 >> 3) & 1);
        uVar155 = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * auVar133._12_4_;
        bVar7 = (bool)((byte)(uVar86 >> 4) & 1);
        uVar156 = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * auVar133._16_4_;
        bVar7 = (bool)((byte)(uVar86 >> 5) & 1);
        uVar157 = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * auVar133._20_4_;
        bVar7 = (bool)((byte)(uVar86 >> 6) & 1);
        uVar158 = (uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * auVar133._24_4_;
        bVar7 = SUB81(uVar86 >> 7,0);
        uVar159 = (uint)bVar7 * auVar126._28_4_ | (uint)!bVar7 * auVar133._28_4_;
        auVar134._0_4_ = (bVar89 & 1) * uVar95 | !(bool)(bVar89 & 1) * auVar134._0_4_;
        bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar134._4_4_ = bVar7 * uVar153 | !bVar7 * auVar134._4_4_;
        bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar134._8_4_ = bVar7 * uVar154 | !bVar7 * auVar134._8_4_;
        bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar134._12_4_ = bVar7 * uVar155 | !bVar7 * auVar134._12_4_;
        bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar134._16_4_ = bVar7 * uVar156 | !bVar7 * auVar134._16_4_;
        bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar134._20_4_ = bVar7 * uVar157 | !bVar7 * auVar134._20_4_;
        bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar134._24_4_ = bVar7 * uVar158 | !bVar7 * auVar134._24_4_;
        bVar7 = SUB81(uVar94 >> 7,0);
        auVar134._28_4_ = bVar7 * uVar159 | !bVar7 * auVar134._28_4_;
        auVar116 = vblendmps_avx512vl(auVar236,auVar116);
        auVar133._0_4_ = (uint)(bVar87 & 1) * auVar116._0_4_ | !(bool)(bVar87 & 1) * uVar95;
        bVar7 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar7 * auVar116._4_4_ | !bVar7 * uVar153;
        bVar7 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar7 * auVar116._8_4_ | !bVar7 * uVar154;
        bVar7 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar7 * auVar116._12_4_ | !bVar7 * uVar155;
        bVar7 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar7 * auVar116._16_4_ | !bVar7 * uVar156;
        bVar7 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar7 * auVar116._20_4_ | !bVar7 * uVar157;
        bVar7 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar7 * auVar116._24_4_ | !bVar7 * uVar158;
        bVar7 = SUB81(uVar86 >> 7,0);
        auVar133._28_4_ = (uint)bVar7 * auVar116._28_4_ | !bVar7 * uVar159;
        auVar135._0_4_ = (bVar89 & 1) * auVar133._0_4_ | !(bool)(bVar89 & 1) * auVar135._0_4_;
        bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar135._4_4_ = bVar7 * auVar133._4_4_ | !bVar7 * auVar135._4_4_;
        bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar135._8_4_ = bVar7 * auVar133._8_4_ | !bVar7 * auVar135._8_4_;
        bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar135._12_4_ = bVar7 * auVar133._12_4_ | !bVar7 * auVar135._12_4_;
        bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar135._16_4_ = bVar7 * auVar133._16_4_ | !bVar7 * auVar135._16_4_;
        bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar135._20_4_ = bVar7 * auVar133._20_4_ | !bVar7 * auVar135._20_4_;
        bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar135._24_4_ = bVar7 * auVar133._24_4_ | !bVar7 * auVar135._24_4_;
        bVar7 = SUB81(uVar94 >> 7,0);
        auVar135._28_4_ = bVar7 * auVar133._28_4_ | !bVar7 * auVar135._28_4_;
        bVar83 = (~bVar89 | bVar87) & bVar83;
      }
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar227 = ZEXT3264(auVar133);
    auVar266 = ZEXT3264(auVar116);
    if ((bVar83 & 0x7f) == 0) {
      auVar268 = ZEXT3264(local_8a0);
      auVar269 = ZEXT3264(local_8c0);
      auVar267 = ZEXT3264(local_8e0);
    }
    else {
      fVar160 = *(float *)(ray + k * 4 + 0x100) - (float)local_7a0._0_4_;
      auVar222._4_4_ = fVar160;
      auVar222._0_4_ = fVar160;
      auVar222._8_4_ = fVar160;
      auVar222._12_4_ = fVar160;
      auVar222._16_4_ = fVar160;
      auVar222._20_4_ = fVar160;
      auVar222._24_4_ = fVar160;
      auVar222._28_4_ = fVar160;
      auVar126 = vminps_avx512vl(auVar222,auVar135);
      auVar79._4_4_ = fStack_3dc;
      auVar79._0_4_ = local_3e0;
      auVar79._8_4_ = fStack_3d8;
      auVar79._12_4_ = fStack_3d4;
      auVar79._16_4_ = fStack_3d0;
      auVar79._20_4_ = fStack_3cc;
      auVar79._24_4_ = fStack_3c8;
      auVar79._28_4_ = fStack_3c4;
      auVar130 = vmaxps_avx512vl(auVar79,auVar134);
      auVar124 = vmulps_avx512vl(auVar124,auVar50);
      auVar123 = vfmadd213ps_avx512vl(auVar123,auVar262,auVar124);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar49,auVar123);
      auVar267 = ZEXT3264(local_8e0);
      auVar123 = vmulps_avx512vl(local_8e0,auVar50);
      auVar269 = ZEXT3264(local_8c0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_8c0,auVar262);
      auVar268 = ZEXT3264(local_8a0);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_8a0,auVar49);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar123,auVar124);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar124,auVar131,1);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar109 = vxorps_avx512vl(auVar109,auVar132);
      auVar136 = vrcp14ps_avx512vl(auVar123);
      auVar137 = vxorps_avx512vl(auVar123,auVar132);
      auVar138 = vfnmadd213ps_avx512vl(auVar136,auVar123,auVar116);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar136,auVar136);
      auVar138 = vmulps_avx512vl(auVar138,auVar109);
      uVar17 = vcmpps_avx512vl(auVar123,auVar137,1);
      bVar89 = (byte)uVar15 | (byte)uVar17;
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar138,auVar139);
      auVar140._0_4_ =
           (uint)(bVar89 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar136._0_4_;
      bVar7 = (bool)(bVar89 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * auVar136._4_4_;
      bVar7 = (bool)(bVar89 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * auVar136._8_4_;
      bVar7 = (bool)(bVar89 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * auVar136._12_4_;
      bVar7 = (bool)(bVar89 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * auVar136._16_4_;
      bVar7 = (bool)(bVar89 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * auVar136._20_4_;
      bVar7 = (bool)(bVar89 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * auVar136._24_4_;
      auVar140._28_4_ =
           (uint)(bVar89 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar136._28_4_;
      auVar109 = vmaxps_avx(auVar130,auVar140);
      uVar17 = vcmpps_avx512vl(auVar123,auVar137,6);
      bVar89 = (byte)uVar15 | (byte)uVar17;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar141._0_4_ =
           (uint)(bVar89 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar138._0_4_;
      bVar7 = (bool)(bVar89 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * auVar138._4_4_;
      bVar7 = (bool)(bVar89 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * auVar138._8_4_;
      bVar7 = (bool)(bVar89 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar138._12_4_;
      bVar7 = (bool)(bVar89 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * auVar138._16_4_;
      bVar7 = (bool)(bVar89 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * auVar138._20_4_;
      bVar7 = (bool)(bVar89 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * auVar138._24_4_;
      auVar141._28_4_ =
           (uint)(bVar89 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar138._28_4_;
      auVar123 = vminps_avx(auVar126,auVar141);
      auVar227 = ZEXT3264(auVar123);
      auVar117 = vsubps_avx(ZEXT832(0) << 0x20,auVar117);
      auVar118 = vsubps_avx(ZEXT832(0) << 0x20,auVar118);
      auVar126 = ZEXT832(0) << 0x20;
      auVar119 = vsubps_avx(auVar126,auVar119);
      auVar55._4_4_ = auVar119._4_4_ * auVar121._4_4_;
      auVar55._0_4_ = auVar119._0_4_ * auVar121._0_4_;
      auVar55._8_4_ = auVar119._8_4_ * auVar121._8_4_;
      auVar55._12_4_ = auVar119._12_4_ * auVar121._12_4_;
      auVar55._16_4_ = auVar119._16_4_ * auVar121._16_4_;
      auVar55._20_4_ = auVar119._20_4_ * auVar121._20_4_;
      auVar55._24_4_ = auVar119._24_4_ * auVar121._24_4_;
      auVar55._28_4_ = auVar119._28_4_;
      auVar118 = vfnmsub231ps_avx512vl(auVar55,auVar110,auVar118);
      auVar117 = vfnmadd231ps_avx512vl(auVar118,auVar120,auVar117);
      auVar118 = vmulps_avx512vl(local_8e0,auVar121);
      auVar118 = vfnmsub231ps_avx512vl(auVar118,local_8c0,auVar110);
      auVar118 = vfnmadd231ps_avx512vl(auVar118,local_8a0,auVar120);
      vandps_avx512vl(auVar118,auVar124);
      uVar15 = vcmpps_avx512vl(auVar118,auVar131,1);
      auVar117 = vxorps_avx512vl(auVar117,auVar132);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar120 = vxorps_avx512vl(auVar118,auVar132);
      auVar261 = ZEXT3264(auVar120);
      auVar121 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar116);
      auVar96 = vfmadd132ps_fma(auVar121,auVar119,auVar119);
      fVar160 = auVar96._0_4_ * auVar117._0_4_;
      fVar239 = auVar96._4_4_ * auVar117._4_4_;
      auVar56._4_4_ = fVar239;
      auVar56._0_4_ = fVar160;
      fVar240 = auVar96._8_4_ * auVar117._8_4_;
      auVar56._8_4_ = fVar240;
      fVar241 = auVar96._12_4_ * auVar117._12_4_;
      auVar56._12_4_ = fVar241;
      fVar244 = auVar117._16_4_ * 0.0;
      auVar56._16_4_ = fVar244;
      fVar242 = auVar117._20_4_ * 0.0;
      auVar56._20_4_ = fVar242;
      fVar243 = auVar117._24_4_ * 0.0;
      auVar56._24_4_ = fVar243;
      auVar56._28_4_ = auVar117._28_4_;
      uVar17 = vcmpps_avx512vl(auVar118,auVar120,1);
      bVar89 = (byte)uVar15 | (byte)uVar17;
      auVar121 = vblendmps_avx512vl(auVar56,auVar139);
      auVar142._0_4_ =
           (uint)(bVar89 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar119._0_4_;
      bVar7 = (bool)(bVar89 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * auVar119._4_4_;
      bVar7 = (bool)(bVar89 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * auVar119._8_4_;
      bVar7 = (bool)(bVar89 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * auVar119._12_4_;
      bVar7 = (bool)(bVar89 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * auVar119._16_4_;
      bVar7 = (bool)(bVar89 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * auVar119._20_4_;
      bVar7 = (bool)(bVar89 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar7 * auVar121._24_4_ | (uint)!bVar7 * auVar119._24_4_;
      auVar142._28_4_ =
           (uint)(bVar89 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar119._28_4_;
      _local_760 = vmaxps_avx(auVar109,auVar142);
      uVar17 = vcmpps_avx512vl(auVar118,auVar120,6);
      bVar89 = (byte)uVar15 | (byte)uVar17;
      auVar143._0_4_ =
           (uint)(bVar89 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar89 & 1) * (int)fVar160;
      bVar7 = (bool)(bVar89 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * (int)fVar239;
      bVar7 = (bool)(bVar89 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * (int)fVar240;
      bVar7 = (bool)(bVar89 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar89 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * (int)fVar244;
      bVar7 = (bool)(bVar89 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar89 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * (int)fVar243;
      auVar143._28_4_ =
           (uint)(bVar89 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar117._28_4_;
      auVar255 = ZEXT3264(auVar143);
      local_440 = vminps_avx(auVar123,auVar143);
      auVar252 = ZEXT3264(local_440);
      uVar15 = vcmpps_avx512vl(_local_760,local_440,2);
      bVar83 = bVar83 & 0x7f & (byte)uVar15;
      if (bVar83 != 0) {
        auVar112 = vmaxps_avx(auVar126,auVar112);
        auVar117 = vminps_avx512vl(local_660,auVar116);
        auVar61 = ZEXT412(0);
        auVar118 = ZEXT1232(auVar61) << 0x20;
        auVar117 = vmaxps_avx(auVar117,ZEXT1232(auVar61) << 0x20);
        auVar119 = vminps_avx512vl(local_680,auVar116);
        auVar57._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
        auVar57._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
        auVar57._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
        auVar57._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
        auVar57._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
        auVar57._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
        auVar57._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
        auVar57._28_4_ = auVar117._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar57,auVar169,auVar232);
        local_660 = ZEXT1632(auVar96);
        auVar117 = vmaxps_avx(auVar119,ZEXT1232(auVar61) << 0x20);
        auVar58._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar117._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar58,auVar169,auVar232);
        local_680 = ZEXT1632(auVar96);
        auVar223._0_4_ = auVar112._0_4_ * auVar112._0_4_;
        auVar223._4_4_ = auVar112._4_4_ * auVar112._4_4_;
        auVar223._8_4_ = auVar112._8_4_ * auVar112._8_4_;
        auVar223._12_4_ = auVar112._12_4_ * auVar112._12_4_;
        auVar223._16_4_ = auVar112._16_4_ * auVar112._16_4_;
        auVar223._20_4_ = auVar112._20_4_ * auVar112._20_4_;
        auVar223._24_4_ = auVar112._24_4_ * auVar112._24_4_;
        auVar223._28_4_ = 0;
        auVar112 = vsubps_avx(local_700,auVar223);
        auVar117 = vmulps_avx512vl(auVar129,auVar112);
        auVar117 = vsubps_avx512vl(auVar128,auVar117);
        uVar15 = vcmpps_avx512vl(auVar117,ZEXT1232(auVar61) << 0x20,5);
        bVar89 = (byte)uVar15;
        if (bVar89 == 0) {
          auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar227 = ZEXT864(0) << 0x20;
          auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar255 = ZEXT864(0) << 0x20;
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar145._8_4_ = 0xff800000;
          auVar145._0_8_ = 0xff800000ff800000;
          auVar145._12_4_ = 0xff800000;
          auVar145._16_4_ = 0xff800000;
          auVar145._20_4_ = 0xff800000;
          auVar145._24_4_ = 0xff800000;
          auVar145._28_4_ = 0xff800000;
        }
        else {
          auVar100 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          uVar94 = vcmpps_avx512vl(auVar117,auVar126,5);
          auVar117 = vsqrtps_avx(auVar117);
          auVar235._0_4_ = auVar113._0_4_ + auVar113._0_4_;
          auVar235._4_4_ = auVar113._4_4_ + auVar113._4_4_;
          auVar235._8_4_ = auVar113._8_4_ + auVar113._8_4_;
          auVar235._12_4_ = auVar113._12_4_ + auVar113._12_4_;
          auVar235._16_4_ = auVar113._16_4_ + auVar113._16_4_;
          auVar235._20_4_ = auVar113._20_4_ + auVar113._20_4_;
          auVar235._24_4_ = auVar113._24_4_ + auVar113._24_4_;
          auVar235._28_4_ = auVar113._28_4_ + auVar113._28_4_;
          auVar118 = vrcp14ps_avx512vl(auVar235);
          auVar116 = vfnmadd213ps_avx512vl(auVar235,auVar118,auVar116);
          auVar96 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
          auVar31._8_4_ = 0x80000000;
          auVar31._0_8_ = 0x8000000080000000;
          auVar31._12_4_ = 0x80000000;
          auVar31._16_4_ = 0x80000000;
          auVar31._20_4_ = 0x80000000;
          auVar31._24_4_ = 0x80000000;
          auVar31._28_4_ = 0x80000000;
          auVar116 = vxorps_avx512vl(auVar125,auVar31);
          auVar116 = vsubps_avx(auVar116,auVar117);
          auVar59._4_4_ = auVar116._4_4_ * auVar96._4_4_;
          auVar59._0_4_ = auVar116._0_4_ * auVar96._0_4_;
          auVar59._8_4_ = auVar116._8_4_ * auVar96._8_4_;
          auVar59._12_4_ = auVar116._12_4_ * auVar96._12_4_;
          auVar59._16_4_ = auVar116._16_4_ * 0.0;
          auVar59._20_4_ = auVar116._20_4_ * 0.0;
          auVar59._24_4_ = auVar116._24_4_ * 0.0;
          auVar59._28_4_ = 0x3e000000;
          auVar117 = vsubps_avx512vl(auVar117,auVar125);
          auVar265._0_4_ = auVar117._0_4_ * auVar96._0_4_;
          auVar265._4_4_ = auVar117._4_4_ * auVar96._4_4_;
          auVar265._8_4_ = auVar117._8_4_ * auVar96._8_4_;
          auVar265._12_4_ = auVar117._12_4_ * auVar96._12_4_;
          auVar265._16_4_ = auVar117._16_4_ * 0.0;
          auVar265._20_4_ = auVar117._20_4_ * 0.0;
          auVar265._24_4_ = auVar117._24_4_ * 0.0;
          auVar265._28_4_ = 0;
          auVar117 = vfmadd213ps_avx512vl(auVar127,auVar59,auVar122);
          auVar60._4_4_ = auVar111._4_4_ * auVar117._4_4_;
          auVar60._0_4_ = auVar111._0_4_ * auVar117._0_4_;
          auVar60._8_4_ = auVar111._8_4_ * auVar117._8_4_;
          auVar60._12_4_ = auVar111._12_4_ * auVar117._12_4_;
          auVar60._16_4_ = auVar111._16_4_ * auVar117._16_4_;
          auVar60._20_4_ = auVar111._20_4_ * auVar117._20_4_;
          auVar60._24_4_ = auVar111._24_4_ * auVar117._24_4_;
          auVar60._28_4_ = auVar116._28_4_;
          auVar116 = vmulps_avx512vl(local_8a0,auVar59);
          auVar117 = vmulps_avx512vl(local_8c0,auVar59);
          auVar118 = vmulps_avx512vl(local_8e0,auVar59);
          auVar119 = vfmadd213ps_avx512vl(auVar114,auVar60,local_960);
          auVar116 = vsubps_avx512vl(auVar116,auVar119);
          auVar227 = ZEXT3264(auVar116);
          auVar116 = vfmadd213ps_avx512vl(auVar115,auVar60,local_6e0);
          auVar116 = vsubps_avx512vl(auVar117,auVar116);
          auVar96 = vfmadd213ps_fma(auVar60,auVar108,local_940);
          auVar117 = vsubps_avx(auVar118,ZEXT1632(auVar96));
          auVar255 = ZEXT3264(auVar117);
          auVar117 = vfmadd213ps_avx512vl(auVar127,auVar265,auVar122);
          auVar117 = vmulps_avx512vl(auVar111,auVar117);
          auVar111 = vmulps_avx512vl(local_8a0,auVar265);
          auVar119 = vmulps_avx512vl(local_8c0,auVar265);
          auVar120 = vmulps_avx512vl(local_8e0,auVar265);
          auVar96 = vfmadd213ps_fma(auVar114,auVar117,local_960);
          auVar118 = vsubps_avx(auVar111,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar115,auVar117,local_6e0);
          auVar111 = vsubps_avx512vl(auVar119,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar108,auVar117,local_940);
          auVar114 = vsubps_avx512vl(auVar120,ZEXT1632(auVar96));
          auVar170._8_4_ = 0x7f800000;
          auVar170._0_8_ = 0x7f8000007f800000;
          auVar170._12_4_ = 0x7f800000;
          auVar170._16_4_ = 0x7f800000;
          auVar170._20_4_ = 0x7f800000;
          auVar170._24_4_ = 0x7f800000;
          auVar170._28_4_ = 0x7f800000;
          auVar115 = vblendmps_avx512vl(auVar170,auVar59);
          bVar7 = (bool)((byte)uVar94 & 1);
          auVar144._0_4_ = (uint)bVar7 * auVar115._0_4_ | (uint)!bVar7 * local_940._0_4_;
          bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * local_940._4_4_;
          bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * local_940._8_4_;
          bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * local_940._12_4_;
          bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * local_940._16_4_;
          bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * local_940._20_4_;
          bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar7 * auVar115._24_4_ | (uint)!bVar7 * local_940._24_4_;
          bVar7 = SUB81(uVar94 >> 7,0);
          auVar144._28_4_ = (uint)bVar7 * auVar115._28_4_ | (uint)!bVar7 * local_940._28_4_;
          auVar171._8_4_ = 0xff800000;
          auVar171._0_8_ = 0xff800000ff800000;
          auVar171._12_4_ = 0xff800000;
          auVar171._16_4_ = 0xff800000;
          auVar171._20_4_ = 0xff800000;
          auVar171._24_4_ = 0xff800000;
          auVar171._28_4_ = 0xff800000;
          auVar115 = vblendmps_avx512vl(auVar171,auVar265);
          bVar7 = (bool)((byte)uVar94 & 1);
          auVar145._0_4_ = (uint)bVar7 * auVar115._0_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar7 * auVar115._4_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar7 * auVar115._8_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar7 * auVar115._12_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar7 * auVar115._16_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar7 * auVar115._20_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar7 * auVar115._24_4_ | (uint)!bVar7 * -0x800000;
          bVar7 = SUB81(uVar94 >> 7,0);
          auVar145._28_4_ = (uint)bVar7 * auVar115._28_4_ | (uint)!bVar7 * -0x800000;
          auVar246._8_4_ = 0x7fffffff;
          auVar246._0_8_ = 0x7fffffff7fffffff;
          auVar246._12_4_ = 0x7fffffff;
          auVar246._16_4_ = 0x7fffffff;
          auVar246._20_4_ = 0x7fffffff;
          auVar246._24_4_ = 0x7fffffff;
          auVar246._28_4_ = 0x7fffffff;
          auVar115 = vandps_avx(auVar246,local_720);
          auVar115 = vmaxps_avx(local_5c0,auVar115);
          auVar32._8_4_ = 0x36000000;
          auVar32._0_8_ = 0x3600000036000000;
          auVar32._12_4_ = 0x36000000;
          auVar32._16_4_ = 0x36000000;
          auVar32._20_4_ = 0x36000000;
          auVar32._24_4_ = 0x36000000;
          auVar32._28_4_ = 0x36000000;
          auVar115 = vmulps_avx512vl(auVar115,auVar32);
          auVar113 = vandps_avx(auVar113,auVar246);
          uVar86 = vcmpps_avx512vl(auVar113,auVar115,1);
          uVar94 = uVar94 & uVar86;
          bVar87 = (byte)uVar94;
          if (bVar87 != 0) {
            uVar86 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar100),2);
            auVar247._8_4_ = 0xff800000;
            auVar247._0_8_ = 0xff800000ff800000;
            auVar247._12_4_ = 0xff800000;
            auVar247._16_4_ = 0xff800000;
            auVar247._20_4_ = 0xff800000;
            auVar247._24_4_ = 0xff800000;
            auVar247._28_4_ = 0xff800000;
            auVar260._8_4_ = 0x7f800000;
            auVar260._0_8_ = 0x7f8000007f800000;
            auVar260._12_4_ = 0x7f800000;
            auVar260._16_4_ = 0x7f800000;
            auVar260._20_4_ = 0x7f800000;
            auVar260._24_4_ = 0x7f800000;
            auVar260._28_4_ = 0x7f800000;
            auVar113 = vblendmps_avx512vl(auVar260,auVar247);
            bVar88 = (byte)uVar86;
            uVar95 = (uint)(bVar88 & 1) * auVar113._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * auVar115._0_4_;
            bVar7 = (bool)((byte)(uVar86 >> 1) & 1);
            uVar153 = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * auVar115._4_4_;
            bVar7 = (bool)((byte)(uVar86 >> 2) & 1);
            uVar154 = (uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * auVar115._8_4_;
            bVar7 = (bool)((byte)(uVar86 >> 3) & 1);
            uVar155 = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * auVar115._12_4_;
            bVar7 = (bool)((byte)(uVar86 >> 4) & 1);
            uVar156 = (uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * auVar115._16_4_;
            bVar7 = (bool)((byte)(uVar86 >> 5) & 1);
            uVar157 = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * auVar115._20_4_;
            bVar7 = (bool)((byte)(uVar86 >> 6) & 1);
            uVar158 = (uint)bVar7 * auVar113._24_4_ | (uint)!bVar7 * auVar115._24_4_;
            bVar7 = SUB81(uVar86 >> 7,0);
            uVar159 = (uint)bVar7 * auVar113._28_4_ | (uint)!bVar7 * auVar115._28_4_;
            auVar144._0_4_ = (bVar87 & 1) * uVar95 | !(bool)(bVar87 & 1) * auVar144._0_4_;
            bVar7 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar144._4_4_ = bVar7 * uVar153 | !bVar7 * auVar144._4_4_;
            bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar144._8_4_ = bVar7 * uVar154 | !bVar7 * auVar144._8_4_;
            bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar144._12_4_ = bVar7 * uVar155 | !bVar7 * auVar144._12_4_;
            bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar144._16_4_ = bVar7 * uVar156 | !bVar7 * auVar144._16_4_;
            bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar144._20_4_ = bVar7 * uVar157 | !bVar7 * auVar144._20_4_;
            bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar144._24_4_ = bVar7 * uVar158 | !bVar7 * auVar144._24_4_;
            bVar7 = SUB81(uVar94 >> 7,0);
            auVar144._28_4_ = bVar7 * uVar159 | !bVar7 * auVar144._28_4_;
            auVar113 = vblendmps_avx512vl(auVar247,auVar260);
            bVar7 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar86 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar86 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar86 >> 6) & 1);
            bVar13 = SUB81(uVar86 >> 7,0);
            auVar145._0_4_ =
                 (uint)(bVar87 & 1) *
                 ((uint)(bVar88 & 1) * auVar113._0_4_ | !(bool)(bVar88 & 1) * uVar95) |
                 !(bool)(bVar87 & 1) * auVar145._0_4_;
            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
            auVar145._4_4_ =
                 (uint)bVar93 * ((uint)bVar7 * auVar113._4_4_ | !bVar7 * uVar153) |
                 !bVar93 * auVar145._4_4_;
            bVar7 = (bool)((byte)(uVar94 >> 2) & 1);
            auVar145._8_4_ =
                 (uint)bVar7 * ((uint)bVar8 * auVar113._8_4_ | !bVar8 * uVar154) |
                 !bVar7 * auVar145._8_4_;
            bVar7 = (bool)((byte)(uVar94 >> 3) & 1);
            auVar145._12_4_ =
                 (uint)bVar7 * ((uint)bVar9 * auVar113._12_4_ | !bVar9 * uVar155) |
                 !bVar7 * auVar145._12_4_;
            bVar7 = (bool)((byte)(uVar94 >> 4) & 1);
            auVar145._16_4_ =
                 (uint)bVar7 * ((uint)bVar10 * auVar113._16_4_ | !bVar10 * uVar156) |
                 !bVar7 * auVar145._16_4_;
            bVar7 = (bool)((byte)(uVar94 >> 5) & 1);
            auVar145._20_4_ =
                 (uint)bVar7 * ((uint)bVar11 * auVar113._20_4_ | !bVar11 * uVar157) |
                 !bVar7 * auVar145._20_4_;
            bVar7 = (bool)((byte)(uVar94 >> 6) & 1);
            auVar145._24_4_ =
                 (uint)bVar7 * ((uint)bVar12 * auVar113._24_4_ | !bVar12 * uVar158) |
                 !bVar7 * auVar145._24_4_;
            bVar7 = SUB81(uVar94 >> 7,0);
            auVar145._28_4_ =
                 (uint)bVar7 * ((uint)bVar13 * auVar113._28_4_ | !bVar13 * uVar159) |
                 !bVar7 * auVar145._28_4_;
            bVar89 = (~bVar87 | bVar88) & bVar89;
          }
        }
        auVar106._8_4_ = 0x7fffffff;
        auVar106._0_8_ = 0x7fffffff7fffffff;
        auVar106._12_4_ = 0x7fffffff;
        auVar261 = ZEXT1664(auVar106);
        auVar113 = vmulps_avx512vl(local_8e0,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_8c0,auVar111);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_8a0,auVar118);
        _local_1c0 = _local_760;
        local_1a0 = vminps_avx(local_440,auVar144);
        auVar238._8_4_ = 0x7fffffff;
        auVar238._0_8_ = 0x7fffffff7fffffff;
        auVar238._12_4_ = 0x7fffffff;
        auVar238._16_4_ = 0x7fffffff;
        auVar238._20_4_ = 0x7fffffff;
        auVar238._24_4_ = 0x7fffffff;
        auVar238._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar113,auVar238);
        _local_6c0 = vmaxps_avx(_local_760,auVar145);
        _local_460 = _local_6c0;
        auVar172._8_4_ = 0x3e99999a;
        auVar172._0_8_ = 0x3e99999a3e99999a;
        auVar172._12_4_ = 0x3e99999a;
        auVar172._16_4_ = 0x3e99999a;
        auVar172._20_4_ = 0x3e99999a;
        auVar172._24_4_ = 0x3e99999a;
        auVar172._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar113,auVar172,1);
        uVar17 = vcmpps_avx512vl(_local_760,local_1a0,2);
        bVar87 = (byte)uVar17 & bVar83;
        uVar16 = vcmpps_avx512vl(_local_6c0,local_440,2);
        if ((bVar83 & ((byte)uVar16 | (byte)uVar17)) == 0) {
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar266 = ZEXT3264(auVar113);
        }
        else {
          auVar113 = vmulps_avx512vl(local_8e0,auVar255._0_32_);
          auVar113 = vfmadd213ps_avx512vl(auVar116,local_8c0,auVar113);
          auVar113 = vfmadd213ps_avx512vl(auVar227._0_32_,local_8a0,auVar113);
          auVar113 = vandps_avx(auVar113,auVar238);
          uVar17 = vcmpps_avx512vl(auVar113,auVar172,1);
          bVar88 = (byte)uVar17 | ~bVar89;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar113 = vpblendmd_avx512vl(auVar173,auVar33);
          local_420._0_4_ = (uint)(bVar88 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar88 & 1) * 2;
          bVar7 = (bool)(bVar88 >> 1 & 1);
          local_420._4_4_ = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar88 >> 2 & 1);
          local_420._8_4_ = (uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar88 >> 3 & 1);
          local_420._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar88 >> 4 & 1);
          local_420._16_4_ = (uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar88 >> 5 & 1);
          local_420._20_4_ = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar88 >> 6 & 1);
          local_420._24_4_ = (uint)bVar7 * auVar113._24_4_ | (uint)!bVar7 * 2;
          local_420._28_4_ = (uint)(bVar88 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar88 >> 7) * 2;
          local_5e0 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_5e0,local_420,5);
          bVar88 = (byte)uVar17 & bVar87;
          if (bVar88 != 0) {
            auVar100 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar96 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar99 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar97 = vminps_avx(auVar100,auVar99);
            auVar100 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar99 = vmaxps_avx(auVar96,auVar100);
            auVar96 = vandps_avx(auVar106,auVar97);
            auVar100 = vandps_avx(auVar106,auVar99);
            auVar96 = vmaxps_avx(auVar96,auVar100);
            auVar100 = vmovshdup_avx(auVar96);
            auVar100 = vmaxss_avx(auVar100,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar100);
            fVar160 = auVar96._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar99,auVar99,0xff);
            local_6a0 = (float)local_760._0_4_ + (float)local_740._0_4_;
            fStack_69c = (float)local_760._4_4_ + (float)local_740._4_4_;
            fStack_698 = fStack_758 + fStack_738;
            fStack_694 = fStack_754 + fStack_734;
            fStack_690 = fStack_750 + fStack_730;
            fStack_68c = fStack_74c + fStack_72c;
            fStack_688 = fStack_748 + fStack_728;
            fStack_684 = fStack_744 + fStack_724;
            do {
              auVar174._8_4_ = 0x7f800000;
              auVar174._0_8_ = 0x7f8000007f800000;
              auVar174._12_4_ = 0x7f800000;
              auVar174._16_4_ = 0x7f800000;
              auVar174._20_4_ = 0x7f800000;
              auVar174._24_4_ = 0x7f800000;
              auVar174._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar174,_local_760);
              auVar146._0_4_ =
                   (uint)(bVar88 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar88 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar88 >> 1 & 1);
              auVar146._4_4_ = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar88 >> 2 & 1);
              auVar146._8_4_ = (uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar88 >> 3 & 1);
              auVar146._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar88 >> 4 & 1);
              auVar146._16_4_ = (uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar88 >> 5 & 1);
              auVar146._20_4_ = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar146._24_4_ =
                   (uint)(bVar88 >> 6) * auVar113._24_4_ | (uint)!(bool)(bVar88 >> 6) * 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar113 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar113 = vminps_avx(auVar146,auVar113);
              auVar111 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar111);
              auVar111 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar111);
              uVar17 = vcmpps_avx512vl(auVar146,auVar113,0);
              bVar84 = (byte)uVar17 & bVar88;
              bVar85 = bVar88;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              iVar18 = 0;
              for (uVar95 = (uint)bVar85; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar95 = *(uint *)(local_660 + (uint)(iVar18 << 2));
              uVar153 = *(uint *)(local_1c0 + (uint)(iVar18 << 2));
              fVar239 = auVar14._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar239 = sqrtf((float)local_880._0_4_);
              }
              auVar255 = ZEXT464(uVar95);
              auVar252 = ZEXT464(uVar153);
              lVar92 = 4;
              do {
                fVar240 = auVar252._0_4_;
                auVar107._4_4_ = fVar240;
                auVar107._0_4_ = fVar240;
                auVar107._8_4_ = fVar240;
                auVar107._12_4_ = fVar240;
                auVar96 = vfmadd132ps_fma(auVar107,ZEXT816(0) << 0x40,local_870);
                fVar248 = auVar255._0_4_;
                fVar213 = 1.0 - fVar248;
                auVar102 = SUB6416(ZEXT464(0x40400000),0);
                auVar101 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar254 = auVar255._0_16_;
                auVar99 = vfmadd213ss_fma(auVar102,auVar254,auVar101);
                auVar100 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar248 * fVar248)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar97 = vfmadd213ss_fma(auVar102,ZEXT416((uint)fVar213),auVar101);
                auVar97 = vfmadd213ss_fma(auVar97,ZEXT416((uint)(fVar213 * fVar213)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar241 = fVar213 * fVar213 * -fVar248 * 0.5;
                fVar244 = auVar100._0_4_ * 0.5;
                fVar242 = auVar97._0_4_ * 0.5;
                fVar243 = fVar248 * fVar248 * -fVar213 * 0.5;
                auVar215._0_4_ = fVar243 * (float)local_860._0_4_;
                auVar215._4_4_ = fVar243 * (float)local_860._4_4_;
                auVar215._8_4_ = fVar243 * fStack_858;
                auVar215._12_4_ = fVar243 * fStack_854;
                auVar228._4_4_ = fVar242;
                auVar228._0_4_ = fVar242;
                auVar228._8_4_ = fVar242;
                auVar228._12_4_ = fVar242;
                auVar100 = vfmadd132ps_fma(auVar228,auVar215,local_820._0_16_);
                auVar198._4_4_ = fVar244;
                auVar198._0_4_ = fVar244;
                auVar198._8_4_ = fVar244;
                auVar198._12_4_ = fVar244;
                auVar100 = vfmadd132ps_fma(auVar198,auVar100,local_840._0_16_);
                auVar216._4_4_ = fVar241;
                auVar216._0_4_ = fVar241;
                auVar216._8_4_ = fVar241;
                auVar216._12_4_ = fVar241;
                auVar100 = vfmadd132ps_fma(auVar216,auVar100,local_800._0_16_);
                auVar97 = vfmadd231ss_fma(auVar101,auVar254,ZEXT416(0x41100000));
                local_700._0_16_ = auVar97;
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar254,
                                          ZEXT416(0x40800000));
                local_720._0_16_ = auVar97;
                local_770 = vfmadd213ss_fma(auVar102,auVar254,ZEXT416(0xbf800000));
                local_6e0._0_16_ = auVar100;
                auVar100 = vsubps_avx(auVar96,auVar100);
                auVar96 = vdpps_avx(auVar100,auVar100,0x7f);
                fVar241 = auVar96._0_4_;
                if (fVar241 < 0.0) {
                  local_940._0_4_ = auVar99._0_4_;
                  local_960._0_16_ = ZEXT416((uint)fVar213);
                  auVar252._0_4_ = sqrtf(fVar241);
                  auVar252._4_60_ = extraout_var;
                  auVar99 = ZEXT416((uint)local_940._0_4_);
                  auVar97 = auVar252._0_16_;
                  auVar101 = local_960._0_16_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar96,auVar96);
                  auVar101 = ZEXT416((uint)fVar213);
                }
                fVar244 = auVar101._0_4_;
                auVar103 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar244 + fVar244))),auVar101,
                                            auVar101);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar248 + fVar248)),
                                          ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar254,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar244 * -3.0)),
                                           ZEXT416((uint)(fVar244 + fVar244)),auVar101);
                auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 * -2.0)),auVar254,
                                           ZEXT416((uint)(fVar248 * fVar248)));
                fVar244 = auVar103._0_4_ * 0.5;
                fVar242 = auVar99._0_4_ * 0.5;
                fVar243 = auVar102._0_4_ * 0.5;
                fVar213 = auVar101._0_4_ * 0.5;
                auVar217._0_4_ = fVar213 * (float)local_860._0_4_;
                auVar217._4_4_ = fVar213 * (float)local_860._4_4_;
                auVar217._8_4_ = fVar213 * fStack_858;
                auVar217._12_4_ = fVar213 * fStack_854;
                auVar199._4_4_ = fVar243;
                auVar199._0_4_ = fVar243;
                auVar199._8_4_ = fVar243;
                auVar199._12_4_ = fVar243;
                auVar99 = vfmadd132ps_fma(auVar199,auVar217,local_820._0_16_);
                auVar179._4_4_ = fVar242;
                auVar179._0_4_ = fVar242;
                auVar179._8_4_ = fVar242;
                auVar179._12_4_ = fVar242;
                auVar99 = vfmadd132ps_fma(auVar179,auVar99,local_840._0_16_);
                auVar263._4_4_ = fVar244;
                auVar263._0_4_ = fVar244;
                auVar263._8_4_ = fVar244;
                auVar263._12_4_ = fVar244;
                local_940._0_16_ = vfmadd132ps_fma(auVar263,auVar99,local_800._0_16_);
                auVar99 = vdpps_avx(local_940._0_16_,local_940._0_16_,0x7f);
                auVar62._12_4_ = 0;
                auVar62._0_12_ = ZEXT812(0);
                fVar244 = auVar99._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar244));
                fVar242 = auVar101._0_4_;
                auVar102 = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar244));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar103 = vxorps_avx512vl(auVar99,auVar19);
                auVar101 = vfnmadd213ss_fma(auVar102,auVar99,SUB6416(ZEXT464(0x40000000),0));
                local_960._0_4_ = auVar97._0_4_;
                if (fVar244 < auVar103._0_4_) {
                  auVar255._0_4_ = sqrtf(fVar244);
                  auVar255._4_60_ = extraout_var_00;
                  auVar97 = ZEXT416((uint)local_960._0_4_);
                  auVar103 = auVar255._0_16_;
                  auVar99 = local_940._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx512f(auVar99,auVar99);
                  auVar99 = local_940._0_16_;
                }
                fVar242 = fVar242 * 1.5 + fVar244 * -0.5 * fVar242 * fVar242 * fVar242;
                auVar162._0_4_ = auVar99._0_4_ * fVar242;
                auVar162._4_4_ = auVar99._4_4_ * fVar242;
                auVar162._8_4_ = auVar99._8_4_ * fVar242;
                auVar162._12_4_ = auVar99._12_4_ * fVar242;
                auVar237 = vdpps_avx(auVar100,auVar162,0x7f);
                fVar245 = auVar97._0_4_;
                fVar243 = auVar237._0_4_;
                auVar163._0_4_ = fVar243 * fVar243;
                auVar163._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                auVar163._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                auVar163._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                auVar104 = vsubps_avx512vl(auVar96,auVar163);
                fVar213 = auVar104._0_4_;
                auVar180._4_12_ = ZEXT812(0) << 0x20;
                auVar180._0_4_ = fVar213;
                auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
                auVar106 = vmulss_avx512f(auVar105,ZEXT416(0x3fc00000));
                auVar107 = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_790 = fVar242;
                  fStack_78c = fVar242;
                  fStack_788 = fVar242;
                  fStack_784 = fVar242;
                  local_780 = auVar105;
                  fVar213 = sqrtf(fVar213);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar97 = ZEXT416((uint)local_960._0_4_);
                  auVar99 = local_940._0_16_;
                  auVar105 = local_780;
                  fVar242 = local_790;
                  fVar249 = fStack_78c;
                  fVar250 = fStack_788;
                  fVar253 = fStack_784;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar213 = auVar104._0_4_;
                  fVar249 = fVar242;
                  fVar250 = fVar242;
                  fVar253 = fVar242;
                }
                auVar259._8_4_ = 0x7fffffff;
                auVar259._0_8_ = 0x7fffffff7fffffff;
                auVar259._12_4_ = 0x7fffffff;
                auVar261 = ZEXT1664(auVar259);
                auVar268 = ZEXT3264(local_8a0);
                auVar269 = ZEXT3264(local_8c0);
                auVar267 = ZEXT3264(local_8e0);
                auVar181._0_4_ = (float)local_770._0_4_ * (float)local_860._0_4_;
                auVar181._4_4_ = (float)local_770._0_4_ * (float)local_860._4_4_;
                auVar181._8_4_ = (float)local_770._0_4_ * fStack_858;
                auVar181._12_4_ = (float)local_770._0_4_ * fStack_854;
                auVar200._4_4_ = local_720._0_4_;
                auVar200._0_4_ = local_720._0_4_;
                auVar200._8_4_ = local_720._0_4_;
                auVar200._12_4_ = local_720._0_4_;
                auVar104 = vfmadd132ps_fma(auVar200,auVar181,local_820._0_16_);
                auVar182._4_4_ = local_700._0_4_;
                auVar182._0_4_ = local_700._0_4_;
                auVar182._8_4_ = local_700._0_4_;
                auVar182._12_4_ = local_700._0_4_;
                auVar104 = vfmadd132ps_fma(auVar182,auVar104,local_840._0_16_);
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar254,
                                           ZEXT416(0x40000000));
                auVar201._0_4_ = auVar254._0_4_;
                auVar201._4_4_ = auVar201._0_4_;
                auVar201._8_4_ = auVar201._0_4_;
                auVar201._12_4_ = auVar201._0_4_;
                auVar254 = vfmadd132ps_fma(auVar201,auVar104,local_800._0_16_);
                auVar183._0_4_ = auVar254._0_4_ * fVar244;
                auVar183._4_4_ = auVar254._4_4_ * fVar244;
                auVar183._8_4_ = auVar254._8_4_ * fVar244;
                auVar183._12_4_ = auVar254._12_4_ * fVar244;
                auVar254 = vdpps_avx(auVar99,auVar254,0x7f);
                fVar244 = auVar254._0_4_;
                auVar202._0_4_ = auVar99._0_4_ * fVar244;
                auVar202._4_4_ = auVar99._4_4_ * fVar244;
                auVar202._8_4_ = auVar99._8_4_ * fVar244;
                auVar202._12_4_ = auVar99._12_4_ * fVar244;
                auVar254 = vsubps_avx(auVar183,auVar202);
                local_9d0 = auVar102._0_4_;
                local_9d0 = auVar101._0_4_ * local_9d0;
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar148._16_16_ = local_8e0._16_16_;
                auVar104 = vxorps_avx512vl(auVar99,auVar20);
                auVar229._0_4_ = fVar242 * auVar254._0_4_ * local_9d0;
                auVar229._4_4_ = fVar249 * auVar254._4_4_ * local_9d0;
                auVar229._8_4_ = fVar250 * auVar254._8_4_ * local_9d0;
                auVar229._12_4_ = fVar253 * auVar254._12_4_ * local_9d0;
                auVar101 = vdpps_avx(auVar104,auVar162,0x7f);
                auVar254 = vmaxss_avx(ZEXT416((uint)fVar160),
                                      ZEXT416((uint)(fVar240 * fVar239 * 1.9073486e-06)));
                auVar103 = vdivss_avx512f(ZEXT416((uint)fVar160),auVar103);
                auVar102 = vdpps_avx(auVar100,auVar229,0x7f);
                auVar97 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar160),auVar254);
                auVar103 = vfmadd213ss_fma(ZEXT416((uint)(fVar245 + 1.0)),auVar103,auVar97);
                auVar97 = vdpps_avx(local_870,auVar162,0x7f);
                fVar244 = auVar101._0_4_ + auVar102._0_4_;
                auVar101 = vdpps_avx(auVar100,auVar104,0x7f);
                auVar104 = vmulss_avx512f(auVar107,auVar105);
                auVar105 = vmulss_avx512f(auVar105,auVar105);
                auVar102 = vdpps_avx(auVar100,local_870,0x7f);
                auVar106 = vaddss_avx512f(auVar106,ZEXT416((uint)(auVar104._0_4_ * auVar105._0_4_)))
                ;
                auVar105 = vfnmadd231ss_fma(auVar101,auVar237,ZEXT416((uint)fVar244));
                auVar104 = vfnmadd231ss_fma(auVar102,auVar237,auVar97);
                auVar101 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar213 = fVar213 - auVar101._0_4_;
                auVar101 = vshufps_avx(auVar99,auVar99,0xff);
                auVar102 = vfmsub213ss_fma(auVar105,auVar106,auVar101);
                fVar242 = auVar104._0_4_ * auVar106._0_4_;
                auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar102._0_4_)),
                                           ZEXT416((uint)fVar244),ZEXT416((uint)fVar242));
                fVar245 = auVar105._0_4_;
                fVar248 = fVar248 - (fVar243 * (fVar242 / fVar245) -
                                    fVar213 * (auVar97._0_4_ / fVar245));
                auVar255 = ZEXT464((uint)fVar248);
                fVar240 = fVar240 - (fVar213 * (fVar244 / fVar245) -
                                    fVar243 * (auVar102._0_4_ / fVar245));
                auVar252 = ZEXT464((uint)fVar240);
                auVar97 = vandps_avx(auVar237,auVar259);
                if (auVar103._0_4_ <= auVar97._0_4_) {
LAB_01db122e:
                  bVar7 = false;
                }
                else {
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ + auVar254._0_4_)),
                                             local_7b0,ZEXT416(0x36000000));
                  auVar97 = vandps_avx(auVar259,ZEXT416((uint)fVar213));
                  if (auVar102._0_4_ <= auVar97._0_4_) goto LAB_01db122e;
                  fVar240 = fVar240 + (float)local_7a0._0_4_;
                  auVar252 = ZEXT464((uint)fVar240);
                  bVar7 = true;
                  if ((((fVar214 <= fVar240) &&
                       (fVar244 = *(float *)(ray + k * 4 + 0x100), fVar240 <= fVar244)) &&
                      (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                    auVar148._0_16_ = ZEXT816(0) << 0x20;
                    auVar147._4_28_ = auVar148._4_28_;
                    auVar147._0_4_ = fVar241;
                    auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar147._0_16_);
                    fVar241 = auVar97._0_4_;
                    auVar96 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar91].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar241 = fVar241 * 1.5 + auVar96._0_4_ * fVar241 * fVar241 * fVar241;
                      auVar184._0_4_ = auVar100._0_4_ * fVar241;
                      auVar184._4_4_ = auVar100._4_4_ * fVar241;
                      auVar184._8_4_ = auVar100._8_4_ * fVar241;
                      auVar184._12_4_ = auVar100._12_4_ * fVar241;
                      auVar97 = vfmadd213ps_fma(auVar101,auVar184,auVar99);
                      auVar96 = vshufps_avx(auVar184,auVar184,0xc9);
                      auVar100 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar185._0_4_ = auVar184._0_4_ * auVar100._0_4_;
                      auVar185._4_4_ = auVar184._4_4_ * auVar100._4_4_;
                      auVar185._8_4_ = auVar184._8_4_ * auVar100._8_4_;
                      auVar185._12_4_ = auVar184._12_4_ * auVar100._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar185,auVar99,auVar96);
                      auVar96 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar100 = vshufps_avx(auVar97,auVar97,0xc9);
                      auVar99 = vshufps_avx(auVar99,auVar99,0xd2);
                      auVar164._0_4_ = auVar97._0_4_ * auVar99._0_4_;
                      auVar164._4_4_ = auVar97._4_4_ * auVar99._4_4_;
                      auVar164._8_4_ = auVar97._8_4_ * auVar99._8_4_;
                      auVar164._12_4_ = auVar97._12_4_ * auVar99._12_4_;
                      auVar96 = vfmsub231ps_fma(auVar164,auVar96,auVar100);
                      uVar161 = auVar96._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar240;
                        uVar3 = vextractps_avx(auVar96,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                        uVar3 = vextractps_avx(auVar96,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar161;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar248;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar2;
                        *(uint *)(ray + k * 4 + 0x240) = uVar91;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar6 = context->user;
                        auVar209._8_4_ = 1;
                        auVar209._0_8_ = 0x100000001;
                        auVar209._12_4_ = 1;
                        auVar209._16_4_ = 1;
                        auVar209._20_4_ = 1;
                        auVar209._24_4_ = 1;
                        auVar209._28_4_ = 1;
                        auVar113 = vpermps_avx2(auVar209,ZEXT1632(auVar96));
                        auVar224._8_4_ = 2;
                        auVar224._0_8_ = 0x200000002;
                        auVar224._12_4_ = 2;
                        auVar224._16_4_ = 2;
                        auVar224._20_4_ = 2;
                        auVar224._24_4_ = 2;
                        auVar224._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar224,ZEXT1632(auVar96));
                        local_580[0] = (RTCHitN)auVar113[0];
                        local_580[1] = (RTCHitN)auVar113[1];
                        local_580[2] = (RTCHitN)auVar113[2];
                        local_580[3] = (RTCHitN)auVar113[3];
                        local_580[4] = (RTCHitN)auVar113[4];
                        local_580[5] = (RTCHitN)auVar113[5];
                        local_580[6] = (RTCHitN)auVar113[6];
                        local_580[7] = (RTCHitN)auVar113[7];
                        local_580[8] = (RTCHitN)auVar113[8];
                        local_580[9] = (RTCHitN)auVar113[9];
                        local_580[10] = (RTCHitN)auVar113[10];
                        local_580[0xb] = (RTCHitN)auVar113[0xb];
                        local_580[0xc] = (RTCHitN)auVar113[0xc];
                        local_580[0xd] = (RTCHitN)auVar113[0xd];
                        local_580[0xe] = (RTCHitN)auVar113[0xe];
                        local_580[0xf] = (RTCHitN)auVar113[0xf];
                        local_580[0x10] = (RTCHitN)auVar113[0x10];
                        local_580[0x11] = (RTCHitN)auVar113[0x11];
                        local_580[0x12] = (RTCHitN)auVar113[0x12];
                        local_580[0x13] = (RTCHitN)auVar113[0x13];
                        local_580[0x14] = (RTCHitN)auVar113[0x14];
                        local_580[0x15] = (RTCHitN)auVar113[0x15];
                        local_580[0x16] = (RTCHitN)auVar113[0x16];
                        local_580[0x17] = (RTCHitN)auVar113[0x17];
                        local_580[0x18] = (RTCHitN)auVar113[0x18];
                        local_580[0x19] = (RTCHitN)auVar113[0x19];
                        local_580[0x1a] = (RTCHitN)auVar113[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar113[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar113[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar113[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar113[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar113[0x1f];
                        local_540 = uVar161;
                        uStack_53c = uVar161;
                        uStack_538 = uVar161;
                        uStack_534 = uVar161;
                        uStack_530 = uVar161;
                        uStack_52c = uVar161;
                        uStack_528 = uVar161;
                        uStack_524 = uVar161;
                        local_520 = fVar248;
                        fStack_51c = fVar248;
                        fStack_518 = fVar248;
                        fStack_514 = fVar248;
                        fStack_510 = fVar248;
                        fStack_50c = fVar248;
                        fStack_508 = fVar248;
                        fStack_504 = fVar248;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_620._0_8_;
                        uStack_4d8 = local_620._8_8_;
                        uStack_4d0 = local_620._16_8_;
                        uStack_4c8 = local_620._24_8_;
                        local_4c0 = local_600;
                        auVar113 = vpcmpeqd_avx2(local_600,local_600);
                        local_908[1] = auVar113;
                        *local_908 = auVar113;
                        local_4a0 = pRVar6->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar6->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar240;
                        local_7e0 = local_640._0_8_;
                        uStack_7d8 = local_640._8_8_;
                        uStack_7d0 = local_640._16_8_;
                        uStack_7c8 = local_640._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar4->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_580;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_990);
                          auVar252 = ZEXT1664(ZEXT416((uint)fVar240));
                          auVar255 = ZEXT1664(ZEXT416((uint)fVar248));
                          auVar267 = ZEXT3264(local_8e0);
                          auVar269 = ZEXT3264(local_8c0);
                          auVar268 = ZEXT3264(local_8a0);
                          auVar261 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar71._8_8_ = uStack_7d8;
                        auVar71._0_8_ = local_7e0;
                        auVar71._16_8_ = uStack_7d0;
                        auVar71._24_8_ = uStack_7c8;
                        if (auVar71 != (undefined1  [32])0x0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_990);
                            auVar252 = ZEXT1664(ZEXT416((uint)fVar240));
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar248));
                            auVar267 = ZEXT3264(local_8e0);
                            auVar269 = ZEXT3264(local_8c0);
                            auVar268 = ZEXT3264(local_8a0);
                            auVar261 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar72._8_8_ = uStack_7d8;
                          auVar72._0_8_ = local_7e0;
                          auVar72._16_8_ = uStack_7d0;
                          auVar72._24_8_ = uStack_7c8;
                          if (auVar72 != (undefined1  [32])0x0) {
                            uVar94 = vptestmd_avx512vl(auVar72,auVar72);
                            iVar64 = *(int *)(local_990.hit + 4);
                            iVar65 = *(int *)(local_990.hit + 8);
                            iVar66 = *(int *)(local_990.hit + 0xc);
                            iVar67 = *(int *)(local_990.hit + 0x10);
                            iVar68 = *(int *)(local_990.hit + 0x14);
                            iVar69 = *(int *)(local_990.hit + 0x18);
                            iVar70 = *(int *)(local_990.hit + 0x1c);
                            bVar85 = (byte)uVar94;
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar85 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x19c);
                            iVar64 = *(int *)(local_990.hit + 0x24);
                            iVar65 = *(int *)(local_990.hit + 0x28);
                            iVar66 = *(int *)(local_990.hit + 0x2c);
                            iVar67 = *(int *)(local_990.hit + 0x30);
                            iVar68 = *(int *)(local_990.hit + 0x34);
                            iVar69 = *(int *)(local_990.hit + 0x38);
                            iVar70 = *(int *)(local_990.hit + 0x3c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1bc);
                            iVar64 = *(int *)(local_990.hit + 0x44);
                            iVar65 = *(int *)(local_990.hit + 0x48);
                            iVar66 = *(int *)(local_990.hit + 0x4c);
                            iVar67 = *(int *)(local_990.hit + 0x50);
                            iVar68 = *(int *)(local_990.hit + 0x54);
                            iVar69 = *(int *)(local_990.hit + 0x58);
                            iVar70 = *(int *)(local_990.hit + 0x5c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1dc);
                            iVar64 = *(int *)(local_990.hit + 100);
                            iVar65 = *(int *)(local_990.hit + 0x68);
                            iVar66 = *(int *)(local_990.hit + 0x6c);
                            iVar67 = *(int *)(local_990.hit + 0x70);
                            iVar68 = *(int *)(local_990.hit + 0x74);
                            iVar69 = *(int *)(local_990.hit + 0x78);
                            iVar70 = *(int *)(local_990.hit + 0x7c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1fc);
                            iVar64 = *(int *)(local_990.hit + 0x84);
                            iVar65 = *(int *)(local_990.hit + 0x88);
                            iVar66 = *(int *)(local_990.hit + 0x8c);
                            iVar67 = *(int *)(local_990.hit + 0x90);
                            iVar68 = *(int *)(local_990.hit + 0x94);
                            iVar69 = *(int *)(local_990.hit + 0x98);
                            iVar70 = *(int *)(local_990.hit + 0x9c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x21c);
                            auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar113;
                            auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar113;
                            auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar113;
                            auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar113;
                            goto LAB_01db1231;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar244;
                      }
                    }
                  }
                }
LAB_01db1231:
                bVar93 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar7) && (bVar93));
              auVar75._4_4_ = fStack_69c;
              auVar75._0_4_ = local_6a0;
              auVar75._8_4_ = fStack_698;
              auVar75._12_4_ = fStack_694;
              auVar75._16_4_ = fStack_690;
              auVar75._20_4_ = fStack_68c;
              auVar75._24_4_ = fStack_688;
              auVar75._28_4_ = fStack_684;
              uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar34._4_4_ = uVar161;
              auVar34._0_4_ = uVar161;
              auVar34._8_4_ = uVar161;
              auVar34._12_4_ = uVar161;
              auVar34._16_4_ = uVar161;
              auVar34._20_4_ = uVar161;
              auVar34._24_4_ = uVar161;
              auVar34._28_4_ = uVar161;
              uVar17 = vcmpps_avx512vl(auVar75,auVar34,2);
              bVar88 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar88 & (byte)uVar17;
            } while (bVar88 != 0);
          }
          auVar175._0_4_ = (float)local_6c0._0_4_ + (float)local_740._0_4_;
          auVar175._4_4_ = (float)local_6c0._4_4_ + (float)local_740._4_4_;
          auVar175._8_4_ = fStack_6b8 + fStack_738;
          auVar175._12_4_ = fStack_6b4 + fStack_734;
          auVar175._16_4_ = fStack_6b0 + fStack_730;
          auVar175._20_4_ = fStack_6ac + fStack_72c;
          auVar175._24_4_ = fStack_6a8 + fStack_728;
          auVar175._28_4_ = fStack_6a4 + fStack_724;
          uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar35._4_4_ = uVar161;
          auVar35._0_4_ = uVar161;
          auVar35._8_4_ = uVar161;
          auVar35._12_4_ = uVar161;
          auVar35._16_4_ = uVar161;
          auVar35._20_4_ = uVar161;
          auVar35._24_4_ = uVar161;
          auVar35._28_4_ = uVar161;
          uVar17 = vcmpps_avx512vl(auVar175,auVar35,2);
          bVar89 = (byte)uVar15 | ~bVar89;
          bVar83 = (byte)uVar16 & bVar83 & (byte)uVar17;
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar113 = vpblendmd_avx512vl(auVar176,auVar36);
          local_6c0._0_4_ = (uint)(bVar89 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar89 & 1) * 2;
          bVar7 = (bool)(bVar89 >> 1 & 1);
          local_6c0._4_4_ = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * 2;
          bVar7 = (bool)(bVar89 >> 2 & 1);
          fStack_6b8 = (float)((uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar89 >> 3 & 1);
          fStack_6b4 = (float)((uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar89 >> 4 & 1);
          fStack_6b0 = (float)((uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar89 >> 5 & 1);
          fStack_6ac = (float)((uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * 2);
          bVar7 = (bool)(bVar89 >> 6 & 1);
          fStack_6a8 = (float)((uint)bVar7 * auVar113._24_4_ | (uint)!bVar7 * 2);
          fStack_6a4 = (float)((uint)(bVar89 >> 7) * auVar113._28_4_ |
                              (uint)!(bool)(bVar89 >> 7) * 2);
          uVar15 = vpcmpd_avx512vl(_local_6c0,local_5e0,2);
          bVar89 = (byte)uVar15 & bVar83;
          if (bVar89 != 0) {
            auVar100 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar96 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar99 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar97 = vminps_avx(auVar100,auVar99);
            auVar100 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar99 = vmaxps_avx(auVar96,auVar100);
            auVar96 = vandps_avx(auVar261._0_16_,auVar97);
            auVar100 = vandps_avx(auVar261._0_16_,auVar99);
            auVar96 = vmaxps_avx(auVar96,auVar100);
            auVar100 = vmovshdup_avx(auVar96);
            auVar100 = vmaxss_avx(auVar100,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar100);
            fVar160 = auVar96._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar99,auVar99,0xff);
            _local_760 = _local_460;
            local_6a0 = (float)local_460._0_4_ + (float)local_740._0_4_;
            fStack_69c = (float)local_460._4_4_ + (float)local_740._4_4_;
            fStack_698 = fStack_458 + fStack_738;
            fStack_694 = fStack_454 + fStack_734;
            fStack_690 = fStack_450 + fStack_730;
            fStack_68c = fStack_44c + fStack_72c;
            fStack_688 = fStack_448 + fStack_728;
            fStack_684 = fStack_444 + fStack_724;
            do {
              auVar177._8_4_ = 0x7f800000;
              auVar177._0_8_ = 0x7f8000007f800000;
              auVar177._12_4_ = 0x7f800000;
              auVar177._16_4_ = 0x7f800000;
              auVar177._20_4_ = 0x7f800000;
              auVar177._24_4_ = 0x7f800000;
              auVar177._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar177,_local_760);
              auVar149._0_4_ =
                   (uint)(bVar89 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
              bVar7 = (bool)(bVar89 >> 1 & 1);
              auVar149._4_4_ = (uint)bVar7 * auVar113._4_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar89 >> 2 & 1);
              auVar149._8_4_ = (uint)bVar7 * auVar113._8_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar89 >> 3 & 1);
              auVar149._12_4_ = (uint)bVar7 * auVar113._12_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar89 >> 4 & 1);
              auVar149._16_4_ = (uint)bVar7 * auVar113._16_4_ | (uint)!bVar7 * 0x7f800000;
              bVar7 = (bool)(bVar89 >> 5 & 1);
              auVar149._20_4_ = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * 0x7f800000;
              auVar149._24_4_ =
                   (uint)(bVar89 >> 6) * auVar113._24_4_ | (uint)!(bool)(bVar89 >> 6) * 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar113 = vshufps_avx(auVar149,auVar149,0xb1);
              auVar113 = vminps_avx(auVar149,auVar113);
              auVar111 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar111);
              auVar111 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar111);
              uVar15 = vcmpps_avx512vl(auVar149,auVar113,0);
              bVar85 = (byte)uVar15 & bVar89;
              bVar88 = bVar89;
              if (bVar85 != 0) {
                bVar88 = bVar85;
              }
              iVar18 = 0;
              for (uVar95 = (uint)bVar88; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar95 = *(uint *)(local_680 + (uint)(iVar18 << 2));
              fVar239 = *(float *)(local_440 + (uint)(iVar18 << 2));
              fVar240 = auVar98._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar240 = sqrtf((float)local_880._0_4_);
              }
              auVar255 = ZEXT464(uVar95);
              lVar92 = 4;
              do {
                auVar165._4_4_ = fVar239;
                auVar165._0_4_ = fVar239;
                auVar165._8_4_ = fVar239;
                auVar165._12_4_ = fVar239;
                auVar96 = vfmadd132ps_fma(auVar165,ZEXT816(0) << 0x40,local_870);
                fVar248 = auVar255._0_4_;
                fVar213 = 1.0 - fVar248;
                auVar102 = SUB6416(ZEXT464(0x40400000),0);
                auVar101 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar254 = auVar255._0_16_;
                auVar99 = vfmadd213ss_fma(auVar102,auVar254,auVar101);
                auVar100 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar248 * fVar248)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar97 = vfmadd213ss_fma(auVar102,ZEXT416((uint)fVar213),auVar101);
                auVar97 = vfmadd213ss_fma(auVar97,ZEXT416((uint)(fVar213 * fVar213)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar241 = fVar213 * fVar213 * -fVar248 * 0.5;
                fVar244 = auVar100._0_4_ * 0.5;
                fVar242 = auVar97._0_4_ * 0.5;
                fVar243 = fVar248 * fVar248 * -fVar213 * 0.5;
                auVar218._0_4_ = fVar243 * (float)local_860._0_4_;
                auVar218._4_4_ = fVar243 * (float)local_860._4_4_;
                auVar218._8_4_ = fVar243 * fStack_858;
                auVar218._12_4_ = fVar243 * fStack_854;
                auVar230._4_4_ = fVar242;
                auVar230._0_4_ = fVar242;
                auVar230._8_4_ = fVar242;
                auVar230._12_4_ = fVar242;
                auVar100 = vfmadd132ps_fma(auVar230,auVar218,local_820._0_16_);
                auVar203._4_4_ = fVar244;
                auVar203._0_4_ = fVar244;
                auVar203._8_4_ = fVar244;
                auVar203._12_4_ = fVar244;
                auVar100 = vfmadd132ps_fma(auVar203,auVar100,local_840._0_16_);
                auVar219._4_4_ = fVar241;
                auVar219._0_4_ = fVar241;
                auVar219._8_4_ = fVar241;
                auVar219._12_4_ = fVar241;
                auVar100 = vfmadd132ps_fma(auVar219,auVar100,local_800._0_16_);
                auVar97 = vfmadd231ss_fma(auVar101,auVar254,ZEXT416(0x41100000));
                local_700._0_16_ = auVar97;
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar254,
                                          ZEXT416(0x40800000));
                local_720._0_16_ = auVar97;
                local_770 = vfmadd213ss_fma(auVar102,auVar254,ZEXT416(0xbf800000));
                local_6e0._0_16_ = auVar100;
                auVar100 = vsubps_avx(auVar96,auVar100);
                auVar96 = vdpps_avx(auVar100,auVar100,0x7f);
                fVar241 = auVar96._0_4_;
                if (fVar241 < 0.0) {
                  local_940._0_4_ = auVar99._0_4_;
                  local_960._0_16_ = ZEXT416((uint)fVar213);
                  auVar261._0_4_ = sqrtf(fVar241);
                  auVar261._4_60_ = extraout_var_01;
                  auVar99 = ZEXT416((uint)local_940._0_4_);
                  auVar97 = auVar261._0_16_;
                  auVar101 = local_960._0_16_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar96,auVar96);
                  auVar101 = ZEXT416((uint)fVar213);
                }
                fVar244 = auVar101._0_4_;
                auVar103 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar244 + fVar244))),auVar101,
                                            auVar101);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)(fVar248 + fVar248)),
                                          ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar254,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar244 * -3.0)),
                                           ZEXT416((uint)(fVar244 + fVar244)),auVar101);
                auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 * -2.0)),auVar254,
                                           ZEXT416((uint)(fVar248 * fVar248)));
                fVar244 = auVar103._0_4_ * 0.5;
                fVar242 = auVar99._0_4_ * 0.5;
                fVar243 = auVar102._0_4_ * 0.5;
                fVar213 = auVar101._0_4_ * 0.5;
                auVar220._0_4_ = fVar213 * (float)local_860._0_4_;
                auVar220._4_4_ = fVar213 * (float)local_860._4_4_;
                auVar220._8_4_ = fVar213 * fStack_858;
                auVar220._12_4_ = fVar213 * fStack_854;
                auVar204._4_4_ = fVar243;
                auVar204._0_4_ = fVar243;
                auVar204._8_4_ = fVar243;
                auVar204._12_4_ = fVar243;
                auVar99 = vfmadd132ps_fma(auVar204,auVar220,local_820._0_16_);
                auVar186._4_4_ = fVar242;
                auVar186._0_4_ = fVar242;
                auVar186._8_4_ = fVar242;
                auVar186._12_4_ = fVar242;
                auVar99 = vfmadd132ps_fma(auVar186,auVar99,local_840._0_16_);
                auVar264._4_4_ = fVar244;
                auVar264._0_4_ = fVar244;
                auVar264._8_4_ = fVar244;
                auVar264._12_4_ = fVar244;
                local_940._0_16_ = vfmadd132ps_fma(auVar264,auVar99,local_800._0_16_);
                auVar99 = vdpps_avx(local_940._0_16_,local_940._0_16_,0x7f);
                auVar63._12_4_ = 0;
                auVar63._0_12_ = ZEXT812(0);
                fVar244 = auVar99._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar244));
                fVar242 = auVar101._0_4_;
                auVar102 = vrcp14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar244));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar103 = vxorps_avx512vl(auVar99,auVar21);
                auVar101 = vfnmadd213ss_fma(auVar102,auVar99,SUB6416(ZEXT464(0x40000000),0));
                local_960._0_4_ = auVar97._0_4_;
                if (fVar244 < auVar103._0_4_) {
                  auVar267._0_4_ = sqrtf(fVar244);
                  auVar267._4_60_ = extraout_var_02;
                  auVar97 = ZEXT416((uint)local_960._0_4_);
                  auVar103 = auVar267._0_16_;
                  auVar99 = local_940._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx512f(auVar99,auVar99);
                  auVar99 = local_940._0_16_;
                }
                fVar242 = fVar242 * 1.5 + fVar244 * -0.5 * fVar242 * fVar242 * fVar242;
                auVar166._0_4_ = auVar99._0_4_ * fVar242;
                auVar166._4_4_ = auVar99._4_4_ * fVar242;
                auVar166._8_4_ = auVar99._8_4_ * fVar242;
                auVar166._12_4_ = auVar99._12_4_ * fVar242;
                auVar237 = vdpps_avx(auVar100,auVar166,0x7f);
                fVar245 = auVar97._0_4_;
                fVar243 = auVar237._0_4_;
                auVar167._0_4_ = fVar243 * fVar243;
                auVar167._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                auVar167._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                auVar167._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                auVar104 = vsubps_avx512vl(auVar96,auVar167);
                fVar213 = auVar104._0_4_;
                auVar187._4_12_ = ZEXT812(0) << 0x20;
                auVar187._0_4_ = fVar213;
                auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
                auVar106 = vmulss_avx512f(auVar105,ZEXT416(0x3fc00000));
                auVar107 = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_790 = fVar242;
                  fStack_78c = fVar242;
                  fStack_788 = fVar242;
                  fStack_784 = fVar242;
                  local_780 = auVar105;
                  fVar213 = sqrtf(fVar213);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar97 = ZEXT416((uint)local_960._0_4_);
                  auVar99 = local_940._0_16_;
                  auVar105 = local_780;
                  fVar242 = local_790;
                  fVar249 = fStack_78c;
                  fVar250 = fStack_788;
                  fVar253 = fStack_784;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar213 = auVar104._0_4_;
                  fVar249 = fVar242;
                  fVar250 = fVar242;
                  fVar253 = fVar242;
                }
                auVar261 = ZEXT1664(auVar100);
                auVar251._8_4_ = 0x7fffffff;
                auVar251._0_8_ = 0x7fffffff7fffffff;
                auVar251._12_4_ = 0x7fffffff;
                auVar252 = ZEXT1664(auVar251);
                auVar268 = ZEXT3264(local_8a0);
                auVar269 = ZEXT3264(local_8c0);
                auVar267 = ZEXT3264(local_8e0);
                auVar188._0_4_ = (float)local_770._0_4_ * (float)local_860._0_4_;
                auVar188._4_4_ = (float)local_770._0_4_ * (float)local_860._4_4_;
                auVar188._8_4_ = (float)local_770._0_4_ * fStack_858;
                auVar188._12_4_ = (float)local_770._0_4_ * fStack_854;
                auVar205._4_4_ = local_720._0_4_;
                auVar205._0_4_ = local_720._0_4_;
                auVar205._8_4_ = local_720._0_4_;
                auVar205._12_4_ = local_720._0_4_;
                auVar104 = vfmadd132ps_fma(auVar205,auVar188,local_820._0_16_);
                auVar189._4_4_ = local_700._0_4_;
                auVar189._0_4_ = local_700._0_4_;
                auVar189._8_4_ = local_700._0_4_;
                auVar189._12_4_ = local_700._0_4_;
                auVar104 = vfmadd132ps_fma(auVar189,auVar104,local_840._0_16_);
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar254,
                                           ZEXT416(0x40000000));
                auVar206._0_4_ = auVar254._0_4_;
                auVar206._4_4_ = auVar206._0_4_;
                auVar206._8_4_ = auVar206._0_4_;
                auVar206._12_4_ = auVar206._0_4_;
                auVar254 = vfmadd132ps_fma(auVar206,auVar104,local_800._0_16_);
                auVar190._0_4_ = auVar254._0_4_ * fVar244;
                auVar190._4_4_ = auVar254._4_4_ * fVar244;
                auVar190._8_4_ = auVar254._8_4_ * fVar244;
                auVar190._12_4_ = auVar254._12_4_ * fVar244;
                auVar254 = vdpps_avx(auVar99,auVar254,0x7f);
                fVar244 = auVar254._0_4_;
                auVar207._0_4_ = auVar99._0_4_ * fVar244;
                auVar207._4_4_ = auVar99._4_4_ * fVar244;
                auVar207._8_4_ = auVar99._8_4_ * fVar244;
                auVar207._12_4_ = auVar99._12_4_ * fVar244;
                auVar254 = vsubps_avx(auVar190,auVar207);
                local_9d0 = auVar102._0_4_;
                local_9d0 = auVar101._0_4_ * local_9d0;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar151._16_16_ = local_8e0._16_16_;
                auVar104 = vxorps_avx512vl(auVar99,auVar22);
                auVar231._0_4_ = fVar242 * auVar254._0_4_ * local_9d0;
                auVar231._4_4_ = fVar249 * auVar254._4_4_ * local_9d0;
                auVar231._8_4_ = fVar250 * auVar254._8_4_ * local_9d0;
                auVar231._12_4_ = fVar253 * auVar254._12_4_ * local_9d0;
                auVar101 = vdpps_avx(auVar104,auVar166,0x7f);
                auVar254 = vmaxss_avx(ZEXT416((uint)fVar160),
                                      ZEXT416((uint)(fVar239 * fVar240 * 1.9073486e-06)));
                auVar103 = vdivss_avx512f(ZEXT416((uint)fVar160),auVar103);
                auVar102 = vdpps_avx(auVar100,auVar231,0x7f);
                auVar97 = vfmadd213ss_fma(auVar97,ZEXT416((uint)fVar160),auVar254);
                auVar103 = vfmadd213ss_fma(ZEXT416((uint)(fVar245 + 1.0)),auVar103,auVar97);
                auVar97 = vdpps_avx(local_870,auVar166,0x7f);
                fVar244 = auVar101._0_4_ + auVar102._0_4_;
                auVar101 = vdpps_avx(auVar100,auVar104,0x7f);
                auVar104 = vmulss_avx512f(auVar107,auVar105);
                auVar105 = vmulss_avx512f(auVar105,auVar105);
                auVar102 = vdpps_avx(auVar100,local_870,0x7f);
                auVar106 = vaddss_avx512f(auVar106,ZEXT416((uint)(auVar104._0_4_ * auVar105._0_4_)))
                ;
                auVar105 = vfnmadd231ss_fma(auVar101,auVar237,ZEXT416((uint)fVar244));
                auVar104 = vfnmadd231ss_fma(auVar102,auVar237,auVar97);
                auVar101 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar213 = fVar213 - auVar101._0_4_;
                auVar101 = vshufps_avx(auVar99,auVar99,0xff);
                auVar102 = vfmsub213ss_fma(auVar105,auVar106,auVar101);
                fVar242 = auVar104._0_4_ * auVar106._0_4_;
                auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar102._0_4_)),
                                           ZEXT416((uint)fVar244),ZEXT416((uint)fVar242));
                fVar245 = auVar105._0_4_;
                fVar248 = fVar248 - (fVar243 * (fVar242 / fVar245) -
                                    fVar213 * (auVar97._0_4_ / fVar245));
                auVar255 = ZEXT464((uint)fVar248);
                fVar239 = fVar239 - (fVar213 * (fVar244 / fVar245) -
                                    fVar243 * (auVar102._0_4_ / fVar245));
                auVar97 = vandps_avx(auVar237,auVar251);
                if (auVar103._0_4_ <= auVar97._0_4_) {
LAB_01db1ec0:
                  bVar7 = false;
                }
                else {
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ + auVar254._0_4_)),
                                             local_7b0,ZEXT416(0x36000000));
                  auVar97 = vandps_avx(auVar251,ZEXT416((uint)fVar213));
                  if (auVar102._0_4_ <= auVar97._0_4_) goto LAB_01db1ec0;
                  fVar239 = fVar239 + (float)local_7a0._0_4_;
                  bVar7 = true;
                  if ((((fVar214 <= fVar239) &&
                       (fVar244 = *(float *)(ray + k * 4 + 0x100), fVar239 <= fVar244)) &&
                      (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                    auVar151._0_16_ = ZEXT816(0) << 0x20;
                    auVar150._4_28_ = auVar151._4_28_;
                    auVar150._0_4_ = fVar241;
                    auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar150._0_16_);
                    fVar241 = auVar97._0_4_;
                    auVar96 = vmulss_avx512f(auVar96,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar91].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar241 = fVar241 * 1.5 + auVar96._0_4_ * fVar241 * fVar241 * fVar241;
                      auVar191._0_4_ = auVar100._0_4_ * fVar241;
                      auVar191._4_4_ = auVar100._4_4_ * fVar241;
                      auVar191._8_4_ = auVar100._8_4_ * fVar241;
                      auVar191._12_4_ = auVar100._12_4_ * fVar241;
                      auVar101 = vfmadd213ps_fma(auVar101,auVar191,auVar99);
                      auVar96 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar97 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar192._0_4_ = auVar191._0_4_ * auVar97._0_4_;
                      auVar192._4_4_ = auVar191._4_4_ * auVar97._4_4_;
                      auVar192._8_4_ = auVar191._8_4_ * auVar97._8_4_;
                      auVar192._12_4_ = auVar191._12_4_ * auVar97._12_4_;
                      auVar97 = vfmsub231ps_fma(auVar192,auVar99,auVar96);
                      auVar96 = vshufps_avx(auVar97,auVar97,0xc9);
                      auVar99 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar97 = vshufps_avx(auVar97,auVar97,0xd2);
                      auVar168._0_4_ = auVar101._0_4_ * auVar97._0_4_;
                      auVar168._4_4_ = auVar101._4_4_ * auVar97._4_4_;
                      auVar168._8_4_ = auVar101._8_4_ * auVar97._8_4_;
                      auVar168._12_4_ = auVar101._12_4_ * auVar97._12_4_;
                      auVar96 = vfmsub231ps_fma(auVar168,auVar96,auVar99);
                      uVar161 = auVar96._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar239;
                        uVar3 = vextractps_avx(auVar96,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                        uVar3 = vextractps_avx(auVar96,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar161;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar248;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar2;
                        *(uint *)(ray + k * 4 + 0x240) = uVar91;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar6 = context->user;
                        auVar210._8_4_ = 1;
                        auVar210._0_8_ = 0x100000001;
                        auVar210._12_4_ = 1;
                        auVar210._16_4_ = 1;
                        auVar210._20_4_ = 1;
                        auVar210._24_4_ = 1;
                        auVar210._28_4_ = 1;
                        auVar113 = vpermps_avx2(auVar210,ZEXT1632(auVar96));
                        auVar225._8_4_ = 2;
                        auVar225._0_8_ = 0x200000002;
                        auVar225._12_4_ = 2;
                        auVar225._16_4_ = 2;
                        auVar225._20_4_ = 2;
                        auVar225._24_4_ = 2;
                        auVar225._28_4_ = 2;
                        local_560 = vpermps_avx2(auVar225,ZEXT1632(auVar96));
                        local_580[0] = (RTCHitN)auVar113[0];
                        local_580[1] = (RTCHitN)auVar113[1];
                        local_580[2] = (RTCHitN)auVar113[2];
                        local_580[3] = (RTCHitN)auVar113[3];
                        local_580[4] = (RTCHitN)auVar113[4];
                        local_580[5] = (RTCHitN)auVar113[5];
                        local_580[6] = (RTCHitN)auVar113[6];
                        local_580[7] = (RTCHitN)auVar113[7];
                        local_580[8] = (RTCHitN)auVar113[8];
                        local_580[9] = (RTCHitN)auVar113[9];
                        local_580[10] = (RTCHitN)auVar113[10];
                        local_580[0xb] = (RTCHitN)auVar113[0xb];
                        local_580[0xc] = (RTCHitN)auVar113[0xc];
                        local_580[0xd] = (RTCHitN)auVar113[0xd];
                        local_580[0xe] = (RTCHitN)auVar113[0xe];
                        local_580[0xf] = (RTCHitN)auVar113[0xf];
                        local_580[0x10] = (RTCHitN)auVar113[0x10];
                        local_580[0x11] = (RTCHitN)auVar113[0x11];
                        local_580[0x12] = (RTCHitN)auVar113[0x12];
                        local_580[0x13] = (RTCHitN)auVar113[0x13];
                        local_580[0x14] = (RTCHitN)auVar113[0x14];
                        local_580[0x15] = (RTCHitN)auVar113[0x15];
                        local_580[0x16] = (RTCHitN)auVar113[0x16];
                        local_580[0x17] = (RTCHitN)auVar113[0x17];
                        local_580[0x18] = (RTCHitN)auVar113[0x18];
                        local_580[0x19] = (RTCHitN)auVar113[0x19];
                        local_580[0x1a] = (RTCHitN)auVar113[0x1a];
                        local_580[0x1b] = (RTCHitN)auVar113[0x1b];
                        local_580[0x1c] = (RTCHitN)auVar113[0x1c];
                        local_580[0x1d] = (RTCHitN)auVar113[0x1d];
                        local_580[0x1e] = (RTCHitN)auVar113[0x1e];
                        local_580[0x1f] = (RTCHitN)auVar113[0x1f];
                        local_540 = uVar161;
                        uStack_53c = uVar161;
                        uStack_538 = uVar161;
                        uStack_534 = uVar161;
                        uStack_530 = uVar161;
                        uStack_52c = uVar161;
                        uStack_528 = uVar161;
                        uStack_524 = uVar161;
                        local_520 = fVar248;
                        fStack_51c = fVar248;
                        fStack_518 = fVar248;
                        fStack_514 = fVar248;
                        fStack_510 = fVar248;
                        fStack_50c = fVar248;
                        fStack_508 = fVar248;
                        fStack_504 = fVar248;
                        local_500 = ZEXT432(0) << 0x20;
                        local_4e0 = local_620._0_8_;
                        uStack_4d8 = local_620._8_8_;
                        uStack_4d0 = local_620._16_8_;
                        uStack_4c8 = local_620._24_8_;
                        local_4c0 = local_600;
                        auVar113 = vpcmpeqd_avx2(local_600,local_600);
                        local_908[1] = auVar113;
                        *local_908 = auVar113;
                        local_4a0 = pRVar6->instID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        local_480 = pRVar6->instPrimID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        *(float *)(ray + k * 4 + 0x100) = fVar239;
                        local_7e0 = local_640._0_8_;
                        uStack_7d8 = local_640._8_8_;
                        uStack_7d0 = local_640._16_8_;
                        uStack_7c8 = local_640._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar4->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_580;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar252 = ZEXT1664(auVar251);
                          auVar261 = ZEXT1664(auVar100);
                          (*pGVar4->intersectionFilterN)(&local_990);
                          auVar255 = ZEXT1664(ZEXT416((uint)fVar248));
                          auVar267 = ZEXT3264(local_8e0);
                          auVar269 = ZEXT3264(local_8c0);
                          auVar268 = ZEXT3264(local_8a0);
                        }
                        auVar73._8_8_ = uStack_7d8;
                        auVar73._0_8_ = local_7e0;
                        auVar73._16_8_ = uStack_7d0;
                        auVar73._24_8_ = uStack_7c8;
                        if (auVar73 != (undefined1  [32])0x0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            (*p_Var5)(&local_990);
                            auVar255 = ZEXT1664(ZEXT416((uint)fVar248));
                            auVar267 = ZEXT3264(local_8e0);
                            auVar269 = ZEXT3264(local_8c0);
                            auVar268 = ZEXT3264(local_8a0);
                          }
                          auVar74._8_8_ = uStack_7d8;
                          auVar74._0_8_ = local_7e0;
                          auVar74._16_8_ = uStack_7d0;
                          auVar74._24_8_ = uStack_7c8;
                          if (auVar74 != (undefined1  [32])0x0) {
                            uVar94 = vptestmd_avx512vl(auVar74,auVar74);
                            iVar64 = *(int *)(local_990.hit + 4);
                            iVar65 = *(int *)(local_990.hit + 8);
                            iVar66 = *(int *)(local_990.hit + 0xc);
                            iVar67 = *(int *)(local_990.hit + 0x10);
                            iVar68 = *(int *)(local_990.hit + 0x14);
                            iVar69 = *(int *)(local_990.hit + 0x18);
                            iVar70 = *(int *)(local_990.hit + 0x1c);
                            bVar88 = (byte)uVar94;
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar88 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x19c);
                            iVar64 = *(int *)(local_990.hit + 0x24);
                            iVar65 = *(int *)(local_990.hit + 0x28);
                            iVar66 = *(int *)(local_990.hit + 0x2c);
                            iVar67 = *(int *)(local_990.hit + 0x30);
                            iVar68 = *(int *)(local_990.hit + 0x34);
                            iVar69 = *(int *)(local_990.hit + 0x38);
                            iVar70 = *(int *)(local_990.hit + 0x3c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar88 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1bc);
                            iVar64 = *(int *)(local_990.hit + 0x44);
                            iVar65 = *(int *)(local_990.hit + 0x48);
                            iVar66 = *(int *)(local_990.hit + 0x4c);
                            iVar67 = *(int *)(local_990.hit + 0x50);
                            iVar68 = *(int *)(local_990.hit + 0x54);
                            iVar69 = *(int *)(local_990.hit + 0x58);
                            iVar70 = *(int *)(local_990.hit + 0x5c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar88 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1dc);
                            iVar64 = *(int *)(local_990.hit + 100);
                            iVar65 = *(int *)(local_990.hit + 0x68);
                            iVar66 = *(int *)(local_990.hit + 0x6c);
                            iVar67 = *(int *)(local_990.hit + 0x70);
                            iVar68 = *(int *)(local_990.hit + 0x74);
                            iVar69 = *(int *)(local_990.hit + 0x78);
                            iVar70 = *(int *)(local_990.hit + 0x7c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar88 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x1fc);
                            iVar64 = *(int *)(local_990.hit + 0x84);
                            iVar65 = *(int *)(local_990.hit + 0x88);
                            iVar66 = *(int *)(local_990.hit + 0x8c);
                            iVar67 = *(int *)(local_990.hit + 0x90);
                            iVar68 = *(int *)(local_990.hit + 0x94);
                            iVar69 = *(int *)(local_990.hit + 0x98);
                            iVar70 = *(int *)(local_990.hit + 0x9c);
                            bVar93 = (bool)((byte)(uVar94 >> 1) & 1);
                            bVar8 = (bool)((byte)(uVar94 >> 2) & 1);
                            bVar9 = (bool)((byte)(uVar94 >> 3) & 1);
                            bVar10 = (bool)((byte)(uVar94 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar94 >> 5) & 1);
                            bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                            bVar13 = SUB81(uVar94 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar88 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar93 * iVar64 |
                                 (uint)!bVar93 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar8 * iVar65 |
                                 (uint)!bVar8 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar9 * iVar66 |
                                 (uint)!bVar9 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar10 * iVar67 |
                                 (uint)!bVar10 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar11 * iVar68 |
                                 (uint)!bVar11 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar12 * iVar69 |
                                 (uint)!bVar12 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar13 * iVar70 |
                                 (uint)!bVar13 * *(int *)(local_990.ray + 0x21c);
                            auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar113;
                            auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar113;
                            auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar113;
                            auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar113;
                            goto LAB_01db1ec3;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar244;
                      }
                    }
                  }
                }
LAB_01db1ec3:
                bVar93 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar7) && (bVar93));
              auVar76._4_4_ = fStack_69c;
              auVar76._0_4_ = local_6a0;
              auVar76._8_4_ = fStack_698;
              auVar76._12_4_ = fStack_694;
              auVar76._16_4_ = fStack_690;
              auVar76._20_4_ = fStack_68c;
              auVar76._24_4_ = fStack_688;
              auVar76._28_4_ = fStack_684;
              uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar37._4_4_ = uVar161;
              auVar37._0_4_ = uVar161;
              auVar37._8_4_ = uVar161;
              auVar37._12_4_ = uVar161;
              auVar37._16_4_ = uVar161;
              auVar37._20_4_ = uVar161;
              auVar37._24_4_ = uVar161;
              auVar37._28_4_ = uVar161;
              uVar15 = vcmpps_avx512vl(auVar76,auVar37,2);
              bVar89 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar89 & (byte)uVar15;
            } while (bVar89 != 0);
          }
          uVar17 = vpcmpd_avx512vl(local_5e0,_local_6c0,1);
          uVar16 = vpcmpd_avx512vl(local_5e0,local_420,1);
          auVar194._0_4_ = (float)local_740._0_4_ + (float)local_1c0._0_4_;
          auVar194._4_4_ = (float)local_740._4_4_ + (float)local_1c0._4_4_;
          auVar194._8_4_ = fStack_738 + fStack_1b8;
          auVar194._12_4_ = fStack_734 + fStack_1b4;
          auVar194._16_4_ = fStack_730 + fStack_1b0;
          auVar194._20_4_ = fStack_72c + fStack_1ac;
          auVar194._24_4_ = fStack_728 + fStack_1a8;
          auVar194._28_4_ = fStack_724 + fStack_1a4;
          uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar211._4_4_ = uVar161;
          auVar211._0_4_ = uVar161;
          auVar211._8_4_ = uVar161;
          auVar211._12_4_ = uVar161;
          auVar211._16_4_ = uVar161;
          auVar211._20_4_ = uVar161;
          auVar211._24_4_ = uVar161;
          auVar211._28_4_ = uVar161;
          uVar15 = vcmpps_avx512vl(auVar194,auVar211,2);
          bVar87 = bVar87 & (byte)uVar16 & (byte)uVar15;
          auVar226._0_4_ = (float)local_740._0_4_ + (float)local_460._0_4_;
          auVar226._4_4_ = (float)local_740._4_4_ + (float)local_460._4_4_;
          auVar226._8_4_ = fStack_738 + fStack_458;
          auVar226._12_4_ = fStack_734 + fStack_454;
          auVar226._16_4_ = fStack_730 + fStack_450;
          auVar226._20_4_ = fStack_72c + fStack_44c;
          auVar226._24_4_ = fStack_728 + fStack_448;
          auVar226._28_4_ = fStack_724 + fStack_444;
          auVar227 = ZEXT3264(auVar226);
          uVar15 = vcmpps_avx512vl(auVar226,auVar211,2);
          bVar83 = bVar83 & (byte)uVar17 & (byte)uVar15 | bVar87;
          prim = local_900;
          if (bVar83 == 0) {
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar266 = ZEXT3264(auVar113);
          }
          else {
            uVar94 = local_8f0 & 0xffffffff;
            abStack_180[uVar94 * 0x60] = bVar83;
            bVar7 = (bool)(bVar87 >> 1 & 1);
            bVar93 = (bool)(bVar87 >> 2 & 1);
            bVar8 = (bool)(bVar87 >> 3 & 1);
            bVar9 = (bool)(bVar87 >> 4 & 1);
            bVar10 = (bool)(bVar87 >> 5 & 1);
            auStack_160[uVar94 * 0x18] =
                 (uint)(bVar87 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar87 & 1) * local_460._0_4_;
            auStack_160[uVar94 * 0x18 + 1] =
                 (uint)bVar7 * local_1c0._4_4_ | (uint)!bVar7 * local_460._4_4_;
            auStack_160[uVar94 * 0x18 + 2] =
                 (uint)bVar93 * (int)fStack_1b8 | (uint)!bVar93 * (int)fStack_458;
            auStack_160[uVar94 * 0x18 + 3] =
                 (uint)bVar8 * (int)fStack_1b4 | (uint)!bVar8 * (int)fStack_454;
            auStack_160[uVar94 * 0x18 + 4] =
                 (uint)bVar9 * (int)fStack_1b0 | (uint)!bVar9 * (int)fStack_450;
            auStack_160[uVar94 * 0x18 + 5] =
                 (uint)bVar10 * (int)fStack_1ac | (uint)!bVar10 * (int)fStack_44c;
            auStack_160[uVar94 * 0x18 + 6] =
                 (uint)(bVar87 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar87 >> 6) * (int)fStack_448;
            (&fStack_144)[uVar94 * 0x18] = fStack_444;
            uVar15 = vmovlps_avx(local_920);
            (&uStack_140)[uVar94 * 0xc] = uVar15;
            afStack_138[uVar94 * 0x18] = (float)((int)local_8f8 + 1);
            local_8f0 = (ulong)((int)local_8f0 + 1);
            auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar266 = ZEXT3264(auVar113);
          }
        }
      }
    }
    auVar212 = ZEXT1664(local_920);
    local_8f0 = local_8f0 & 0xffffffff;
    do {
      if ((int)local_8f0 == 0) {
        uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar39._4_4_ = uVar161;
        auVar39._0_4_ = uVar161;
        auVar39._8_4_ = uVar161;
        auVar39._12_4_ = uVar161;
        auVar39._16_4_ = uVar161;
        auVar39._20_4_ = uVar161;
        auVar39._24_4_ = uVar161;
        auVar39._28_4_ = uVar161;
        uVar15 = vcmpps_avx512vl(local_400,auVar39,2);
        uVar91 = (uint)local_8e8 & (uint)uVar15;
        local_8e8 = (ulong)uVar91;
        if (uVar91 == 0) {
          return;
        }
        goto LAB_01daf9f0;
      }
      uVar94 = (ulong)((int)local_8f0 - 1);
      auVar113 = *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x18);
      auVar195._0_4_ = auVar113._0_4_ + (float)local_740._0_4_;
      auVar195._4_4_ = auVar113._4_4_ + (float)local_740._4_4_;
      auVar195._8_4_ = auVar113._8_4_ + fStack_738;
      auVar195._12_4_ = auVar113._12_4_ + fStack_734;
      auVar195._16_4_ = auVar113._16_4_ + fStack_730;
      auVar195._20_4_ = auVar113._20_4_ + fStack_72c;
      auVar195._24_4_ = auVar113._24_4_ + fStack_728;
      auVar195._28_4_ = auVar113._28_4_ + fStack_724;
      uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar38._4_4_ = uVar161;
      auVar38._0_4_ = uVar161;
      auVar38._8_4_ = uVar161;
      auVar38._12_4_ = uVar161;
      auVar38._16_4_ = uVar161;
      auVar38._20_4_ = uVar161;
      auVar38._24_4_ = uVar161;
      auVar38._28_4_ = uVar161;
      uVar15 = vcmpps_avx512vl(auVar195,auVar38,2);
      uVar95 = (uint)uVar15 & (uint)abStack_180[uVar94 * 0x60];
      bVar83 = (byte)uVar95;
      if (uVar95 != 0) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar111 = vblendmps_avx512vl(auVar196,auVar113);
        auVar152._0_4_ =
             (uint)(bVar83 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar83 & 1) * (int)auVar113._0_4_;
        bVar7 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar152._4_4_ = (uint)bVar7 * auVar111._4_4_ | (uint)!bVar7 * (int)auVar113._4_4_;
        bVar7 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar152._8_4_ = (uint)bVar7 * auVar111._8_4_ | (uint)!bVar7 * (int)auVar113._8_4_;
        bVar7 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar152._12_4_ = (uint)bVar7 * auVar111._12_4_ | (uint)!bVar7 * (int)auVar113._12_4_;
        bVar7 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar152._16_4_ = (uint)bVar7 * auVar111._16_4_ | (uint)!bVar7 * (int)auVar113._16_4_;
        bVar7 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar152._20_4_ = (uint)bVar7 * auVar111._20_4_ | (uint)!bVar7 * (int)auVar113._20_4_;
        bVar7 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar152._24_4_ = (uint)bVar7 * auVar111._24_4_ | (uint)!bVar7 * (int)auVar113._24_4_;
        auVar152._28_4_ =
             (uVar95 >> 7) * auVar111._28_4_ | (uint)!SUB41(uVar95 >> 7,0) * (int)auVar113._28_4_;
        auVar113 = vshufps_avx(auVar152,auVar152,0xb1);
        auVar113 = vminps_avx(auVar152,auVar113);
        auVar111 = vshufpd_avx(auVar113,auVar113,5);
        auVar113 = vminps_avx(auVar113,auVar111);
        auVar111 = vpermpd_avx2(auVar113,0x4e);
        auVar113 = vminps_avx(auVar113,auVar111);
        uVar15 = vcmpps_avx512vl(auVar152,auVar113,0);
        bVar89 = (byte)uVar15 & bVar83;
        if (bVar89 != 0) {
          uVar95 = (uint)bVar89;
        }
        fVar160 = afStack_138[uVar94 * 0x18 + -1];
        uVar153 = 0;
        for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
          uVar153 = uVar153 + 1;
        }
        local_8f8 = (ulong)(uint)afStack_138[uVar94 * 0x18];
        bVar89 = ~('\x01' << ((byte)uVar153 & 0x1f)) & bVar83;
        abStack_180[uVar94 * 0x60] = bVar89;
        uVar86 = uVar94;
        if (bVar89 != 0) {
          uVar86 = local_8f0;
        }
        fVar239 = *(float *)(&uStack_140 + uVar94 * 0xc);
        auVar197._4_4_ = fVar239;
        auVar197._0_4_ = fVar239;
        auVar197._8_4_ = fVar239;
        auVar197._12_4_ = fVar239;
        auVar197._16_4_ = fVar239;
        auVar197._20_4_ = fVar239;
        auVar197._24_4_ = fVar239;
        auVar197._28_4_ = fVar239;
        fVar160 = fVar160 - fVar239;
        auVar178._4_4_ = fVar160;
        auVar178._0_4_ = fVar160;
        auVar178._8_4_ = fVar160;
        auVar178._12_4_ = fVar160;
        auVar178._16_4_ = fVar160;
        auVar178._20_4_ = fVar160;
        auVar178._24_4_ = fVar160;
        auVar178._28_4_ = fVar160;
        auVar96 = vfmadd132ps_fma(auVar178,auVar197,_DAT_02020f20);
        auVar113 = ZEXT1632(auVar96);
        local_580[0] = (RTCHitN)auVar113[0];
        local_580[1] = (RTCHitN)auVar113[1];
        local_580[2] = (RTCHitN)auVar113[2];
        local_580[3] = (RTCHitN)auVar113[3];
        local_580[4] = (RTCHitN)auVar113[4];
        local_580[5] = (RTCHitN)auVar113[5];
        local_580[6] = (RTCHitN)auVar113[6];
        local_580[7] = (RTCHitN)auVar113[7];
        local_580[8] = (RTCHitN)auVar113[8];
        local_580[9] = (RTCHitN)auVar113[9];
        local_580[10] = (RTCHitN)auVar113[10];
        local_580[0xb] = (RTCHitN)auVar113[0xb];
        local_580[0xc] = (RTCHitN)auVar113[0xc];
        local_580[0xd] = (RTCHitN)auVar113[0xd];
        local_580[0xe] = (RTCHitN)auVar113[0xe];
        local_580[0xf] = (RTCHitN)auVar113[0xf];
        local_580[0x10] = (RTCHitN)auVar113[0x10];
        local_580[0x11] = (RTCHitN)auVar113[0x11];
        local_580[0x12] = (RTCHitN)auVar113[0x12];
        local_580[0x13] = (RTCHitN)auVar113[0x13];
        local_580[0x14] = (RTCHitN)auVar113[0x14];
        local_580[0x15] = (RTCHitN)auVar113[0x15];
        local_580[0x16] = (RTCHitN)auVar113[0x16];
        local_580[0x17] = (RTCHitN)auVar113[0x17];
        local_580[0x18] = (RTCHitN)auVar113[0x18];
        local_580[0x19] = (RTCHitN)auVar113[0x19];
        local_580[0x1a] = (RTCHitN)auVar113[0x1a];
        local_580[0x1b] = (RTCHitN)auVar113[0x1b];
        local_580[0x1c] = (RTCHitN)auVar113[0x1c];
        local_580[0x1d] = (RTCHitN)auVar113[0x1d];
        local_580[0x1e] = (RTCHitN)auVar113[0x1e];
        local_580[0x1f] = (RTCHitN)auVar113[0x1f];
        auVar212 = ZEXT864(*(ulong *)(local_580 + (ulong)uVar153 * 4));
        uVar94 = uVar86;
      }
      local_8f0 = uVar94;
    } while (bVar83 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }